

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O2

NDSTATUS NdDecodeWithContext(INSTRUX *Instrux,ND_UINT8 *Code,ND_SIZET Size,ND_CONTEXT *Context)

{
  ND_OPERAND *pNVar1;
  byte *pbVar2;
  ND_UINT32 *pNVar3;
  ND_UINT8 *Code_00;
  ND_UINT8 *pNVar4;
  ND_UINT16 NVar5;
  ND_UINT32 NVar6;
  ND_UINT32 NVar7;
  ND_UINT32 NVar8;
  undefined8 uVar9;
  sbyte sVar10;
  sbyte sVar11;
  ND_UINT8 NVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  NDSTATUS NVar17;
  NDSTATUS NVar18;
  ND_REG_TYPE NVar19;
  ulong uVar20;
  ND_UINT64 NVar21;
  byte bVar22;
  undefined2 uVar23;
  ushort uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined4 *puVar28;
  byte bVar29;
  uint uVar30;
  int iVar31;
  ND_TABLE_OPCODE *pNVar32;
  ND_TABLE_EX_M *pNVar33;
  ND_TABLE_OPCODE *pNVar34;
  undefined3 *puVar35;
  bool bVar36;
  ushort uVar37;
  byte bVar38;
  ND_UINT8 NVar39;
  anon_struct_4_18_63b3064b_for_Exs aVar40;
  long lVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  byte bVar45;
  ND_OPERAND *pNVar46;
  ulong uVar47;
  ulong uVar48;
  ushort uVar49;
  long in_FS_OFFSET;
  bool bVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ulong uStack_c0;
  ushort *local_a8;
  byte local_80;
  uint local_64;
  undefined1 local_60;
  byte local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  NVar18 = 0x80000100;
  if (((((Context == (ND_CONTEXT *)0x0 || Size == 0) ||
         (Code == (ND_UINT8 *)0x0 || Instrux == (INSTRUX *)0x0)) ||
       (uVar30 = (uint)*(undefined8 *)Context, 0x2000 < (uVar30 & 0xf000))) || (2 < (uVar30 & 0xf)))
     || (0x20 < (uVar30 & 0xf0))) goto LAB_0015ab36;
  if ((Context->Options & 2) == 0) {
    nd_memset(Instrux,0,0x1e8);
    uVar30 = (uint)*(undefined8 *)Context;
  }
  uVar42 = *(uint *)Instrux;
  uVar30 = uVar30 & 3;
  *(uint *)Instrux = uVar42 & 0xfffffffc | uVar30;
  uVar42 = (uVar42 & 0xfffffff0 | uVar30) + (*(uint *)Context >> 4 & 3) * 4;
  *(uint *)Instrux = uVar42;
  uVar14 = *(uint *)Context >> 4 & 0x30;
  *(uint *)Instrux = uVar42 & 0xffffffcf | uVar14;
  uVar15 = (*(uint *)Context & 0xf000) << 0x10;
  *(uint *)Instrux = uVar42 & 0xfffffcf | uVar14 | uVar15;
  uVar25 = uVar42 & 0xff0ffcf | uVar14 | uVar15;
  bVar29 = Context->field_0x2;
  Instrux->FeatMode = bVar29;
  *(uint *)Instrux = uVar25;
  uVar16 = 0xf;
  if (Size < 0xf) {
    uVar16 = (uint)Size;
  }
  Code_00 = Instrux->InstructionBytes;
  for (lVar41 = 0; (uint)lVar41 < uVar16; lVar41 = lVar41 + 1) {
    Instrux->InstructionBytes[lVar41] = Code[lVar41];
  }
  if (""[*Code_00] != '\0') {
    bVar38 = 0;
    do {
      uVar47 = (ulong)bVar38;
      if (Size <= uVar47) goto LAB_0015b231;
      bVar45 = Code_00[uVar47];
      NVar12 = ""[bVar45];
      if (NVar12 != '\x01') {
        if (NVar12 != '\0') {
          if ((uVar30 == 2) && (NVar12 == '\x03')) {
            Instrux->field_0x5 = Instrux->field_0x5 | 1;
            *(byte *)&Instrux->field_73 = bVar45;
            halt_baddata();
          }
LAB_0015ae01:
          if (Size <= uVar47) goto LAB_0015b231;
          bVar38 = Code_00[uVar47];
          if (""[bVar38] == '\x02') {
            if (bVar38 == 0x62) {
              if (Size < uVar47 + 2) goto LAB_0015b231;
              if ((uVar30 == 2) || (0xbf < Instrux->InstructionBytes[uVar47 + 1])) {
                NVar18 = 0x80000001;
                if (Size < uVar47 + 4) goto LAB_0015ab36;
                uVar42 = *(uint *)&Instrux->field_0x5;
                uVar25 = uVar25 | 0x30000;
                *(uint *)&Instrux->field_0x5 = uVar42 | 0x10;
                *(uint *)Instrux = uVar25;
                (Instrux->field_73).Rex = (ND_REX)0x62;
                *(ND_UINT8 *)((long)&Instrux->field_73 + 1) = Instrux->InstructionBytes[uVar47 + 1];
                *(ND_UINT8 *)((long)&Instrux->field_73 + 2) = Instrux->InstructionBytes[uVar47 + 2];
                NVar18 = 0x80000008;
                bVar38 = Instrux->InstructionBytes[uVar47 + 3];
                *(byte *)((long)&Instrux->field_73 + 3) = bVar38;
                if ((uVar42 & 0x3a3) != 0) goto LAB_0015ab36;
                uVar49 = *(ushort *)((long)&Instrux->field_73 + 1);
                uVar16 = (uint)uVar49;
                NVar18 = 0x80000002;
                uVar42 = uVar16 & 7;
                if (((uVar49 & 7) == 0) ||
                   (((uVar42 == 7 || (uVar42 == 4)) && ((bVar29 & 0x10) == 0)))) goto LAB_0015ab36;
                auVar52 = vpbroadcastw_avx512vl();
                auVar53 = vpsrlvw_avx512vl(auVar52,_DAT_00167a80);
                auVar52._8_8_ = 0x20000800040002;
                auVar52._0_8_ = 0x20000800040002;
                auVar53 = vpandq_avx512vl(auVar53,auVar52);
                uVar15 = bVar38 >> 3 & 1;
                uVar14 = (~uVar16 & 0x7800) << 5;
                auVar52 = vpshufd_avx(auVar53,0x55);
                auVar52 = vpor_avx(auVar53,auVar52);
                auVar53 = vpsrld_avx(auVar52,0x10);
                auVar52 = vpor_avx(auVar53,auVar52);
                uVar42 = ((((uVar49 & 0x10) + (uVar16 & 8) * 8 | uVar42 << 9 | auVar52._0_4_) ^ 0x3e
                          ) & 0xffff |
                         (uint)(bVar38 >> 7) << 0x16 | (uVar15 ^ 1) << 0x14 | (uint)(uVar49 >> 0xf)
                         | uVar49 >> 1 & 0x180) + (bVar38 >> 5 & 3) * 0x4000;
                uVar16 = (bVar38 >> 4 & 1) * 0x4200000 +
                         ((uint)bVar38 << 0x1c | (bVar38 & 7) << 0x17 |
                         (uint)(bVar38 >> 2 & 1) << 0x1b);
                Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)(uVar16 | uVar42 | uVar14);
                if ((uVar30 != 2) &&
                   (Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                                   (uVar16 | uVar42 & 0xfff0cf81 | uVar14 & 0x70000),
                   (char)uVar15 == '\0')) {
                  NVar18 = 0x80000040;
                  goto LAB_0015ab36;
                }
                bVar29 = Instrux->Length + 4;
LAB_0015b402:
                Instrux->Length = bVar29;
LAB_0015b219:
                NVar18 = 0x80000003;
                if (0xf < bVar29) goto LAB_0015ab36;
              }
            }
            else if (bVar38 == 0xd5) {
              if ((bVar29 & 0x10) != 0 && uVar30 == 2) {
                NVar18 = 0x80000001;
                if (uVar47 + 2 <= Size) {
                  uVar30 = *(uint *)&Instrux->field_0x5;
                  uVar25 = uVar42 & 0xff0ffce | uVar14 | uVar15;
                  *(uint *)&Instrux->field_0x5 = uVar30 | 2;
                  *(uint *)Instrux = uVar25;
                  (Instrux->field_73).Rex = (ND_REX)0xd5;
                  NVar18 = 0x80000004;
                  bVar29 = Instrux->InstructionBytes[uVar47 + 1];
                  *(byte *)((long)&Instrux->field_73 + 1) = bVar29;
                  if ((uVar30 & 1) == 0) {
                    Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                                   ((uint)(byte)(bVar29 & 0x20 | bVar29 >> 1 & 2 |
                                                 bVar29 >> 2 & 0x10 | bVar29 * '\x02' & 4 |
                                                 bVar29 * '\b' & 8 | bVar29 * '\x04' & 0x40 |
                                                bVar29 >> 3 & 1) | (uint)Instrux->Exs & 0xffffff80);
LAB_0015b0ef:
                    bVar29 = Instrux->Length + 2;
LAB_0015b20f:
                    Instrux->Length = bVar29;
                    goto LAB_0015b219;
                  }
                }
                goto LAB_0015ab36;
              }
            }
            else if (bVar38 == 0xc4) {
              if (Size < uVar47 + 2) goto LAB_0015b231;
              if ((uVar30 == 2) || (0xbf < Instrux->InstructionBytes[uVar47 + 1])) {
                NVar18 = 0x80000001;
                if (uVar47 + 3 <= Size) {
                  NVar18 = 0x80000007;
                  if ((*(uint *)&Instrux->field_0x5 & 0x3a3) == 0) {
                    uVar25 = uVar42 & 0xfc0ffcf | uVar14 | uVar15 | 0x120000;
                    *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 4;
                    *(uint *)Instrux = uVar25;
                    (Instrux->field_73).Rex = (ND_REX)0xc4;
                    *(ND_UINT8 *)((long)&Instrux->field_73 + 1) =
                         Instrux->InstructionBytes[uVar47 + 1];
                    *(ND_UINT8 *)((long)&Instrux->field_73 + 2) =
                         Instrux->InstructionBytes[uVar47 + 2];
                    uVar49 = *(ushort *)((long)&Instrux->field_73 + 1);
                    uVar16 = ~(uint)uVar49;
                    uVar14 = uVar16 >> 4 & 4;
                    uVar42 = ((uVar49 & 0x1f) << 9 |
                              (uint)(uVar49 >> 0xf) | (uint)Instrux->Exs & 0xfff00070 |
                              (uVar49 & 0x400) << 4 | uVar49 >> 1 & 0x180) + (uVar16 >> 7 & 1) * 2;
                    aVar40 = (anon_struct_4_18_63b3064b_for_Exs)
                             (uVar42 & 0xfff07ff7 | uVar14 | uVar16 << 5 & 0x70000);
                    if (uVar30 == 2) {
                      aVar40 = (anon_struct_4_18_63b3064b_for_Exs)
                               ((uVar16 << 5 & 0xf0000) + (uVar16 >> 5 & 1) * 8 | uVar42 | uVar14);
                    }
                    Instrux->Exs = aVar40;
                    bVar29 = Instrux->Length + 3;
                    goto LAB_0015b20f;
                  }
                }
                goto LAB_0015ab36;
              }
            }
            else if (bVar38 == 0xc5) {
              NVar18 = 0x80000001;
              if (Size < uVar47 + 2) goto LAB_0015ab36;
              if ((uVar30 == 2) || (0xbf < Instrux->InstructionBytes[uVar47 + 1])) {
                NVar18 = 0x80000007;
                if ((*(uint *)&Instrux->field_0x5 & 0x3a3) == 0) {
                  uVar25 = uVar42 & 0xfc0ffcf | uVar14 | uVar15 | 0x20000;
                  *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 4;
                  *(uint *)Instrux = uVar25;
                  (Instrux->field_73).Rex = (ND_REX)0xc5;
                  bVar29 = Instrux->InstructionBytes[uVar47 + 1];
                  *(byte *)((long)&Instrux->field_73 + 1) = bVar29;
                  uVar30 = (uint)bVar29;
                  Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                                 ((uVar30 & 3) * 0x80 + 0x200 +
                                 ((uVar30 & 4) << 0xc |
                                 (~uVar30 & 0x78) << 0xd |
                                 ((uint)Instrux->Exs & 0xfff0007d) + (uint)(-1 < (char)bVar29) * 2))
                  ;
                  goto LAB_0015b0ef;
                }
                goto LAB_0015ab36;
              }
            }
            else {
              NVar18 = 0x80000101;
              if (bVar38 != 0x8f) goto LAB_0015ab36;
              if (Size < uVar47 + 2) goto LAB_0015b231;
              bVar29 = Instrux->InstructionBytes[uVar47 + 1];
              if ((bVar29 & 0x18) != 0) {
                NVar18 = 0x80000001;
                if (Size < uVar47 + 3) goto LAB_0015ab36;
                NVar18 = 0x80000006;
                if ((*(uint *)&Instrux->field_0x5 & 0x323) != 0) goto LAB_0015ab36;
                uVar25 = uVar25 | 0x10000;
                *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 8;
                *(uint *)Instrux = uVar25;
                (Instrux->field_73).Rex = (ND_REX)0x8f;
                *(byte *)((long)&Instrux->field_73 + 1) = bVar29;
                *(ND_UINT8 *)((long)&Instrux->field_73 + 2) = Instrux->InstructionBytes[uVar47 + 2];
                uVar49 = *(ushort *)((long)&Instrux->field_73 + 1);
                uVar42 = ~(uint)uVar49;
                uVar15 = uVar42 >> 0xb & 0xf;
                uVar16 = uVar42 >> 4 & 4;
                uVar43 = uVar42 >> 6 & 2;
                uVar44 = uVar15 << 0x10;
                uVar42 = ((uVar49 & 0x1f) << 9 |
                         (uVar49 & 0x400) << 4 |
                         (uint)Instrux->Exs & 0xfff00070 | (uint)(uVar49 >> 0xf)) +
                         (uVar42 >> 5 & 1) * 8;
                uVar14 = uVar49 >> 1 & 0x180 | uVar43 | uVar16;
                Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)(uVar14 | uVar42 | uVar44);
                if (uVar30 != 2) {
                  NVar18 = 0x80000009;
                  if (((short)(uVar16 >> 2) != 0 || (short)(uVar43 >> 1) != 0) ||
                     (7 < (ushort)uVar15)) goto LAB_0015ab36;
                  Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)
                                 (uVar14 | uVar42 & 0xffff7ff7 | uVar44);
                }
                bVar29 = Instrux->Length + 3;
                goto LAB_0015b402;
              }
            }
          }
        }
        uVar30 = Instrux->Length & 0xf;
        *(ulong *)&Instrux->field_0xc =
             (ulong)(uVar30 << 8) |
             *(ulong *)&Instrux->field_0xc & 0xfffff0fffffff0ff | (ulong)uVar30 << 0x28;
        goto LAB_0015b438;
      }
      uVar26 = (ulong)(bVar45 - 0x2e);
      if (bVar45 - 0x2e < 0x3a) {
        if ((0xc0000000010101U >> (uVar26 & 0x3f) & 1) != 0) goto LAB_0015acec;
        uVar16 = 0x20;
        if (uVar26 != 0x38) {
          if (uVar26 != 0x39) goto LAB_0015ad63;
          uVar16 = 0x40;
        }
LAB_0015ad0c:
        *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | uVar16;
      }
      else {
LAB_0015ad63:
        if (bVar45 != 0x26) {
          if (bVar45 == 0xf0) {
            uVar16 = 0x80;
          }
          else if (bVar45 == 0xf2) {
            Instrux->Rep = 0xf2;
            uVar16 = 0x100;
          }
          else {
            if (bVar45 != 0xf3) goto LAB_0015ae01;
            Instrux->Rep = 0xf3;
            uVar16 = 0x200;
          }
          goto LAB_0015ad0c;
        }
LAB_0015acec:
        if ((uVar30 != 2) || ((bVar45 & 0xfe) == 100)) {
LAB_0015ad02:
          Instrux->Seg = bVar45;
LAB_0015ad06:
          uVar16 = 0x400;
          goto LAB_0015ad0c;
        }
        if ((Instrux->Seg & 0xfe) != 100 && bVar45 == 0x3e) {
          Instrux->Seg = '>';
          goto LAB_0015ad06;
        }
        uVar16 = Instrux->Seg - 0x3e;
        if ((0x27 < uVar16) || ((0xc000000001U >> ((ulong)uVar16 & 0x3f) & 1) == 0))
        goto LAB_0015ad02;
      }
      if ((*(uint *)&Instrux->field_0x5 & 1) != 0) {
        *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 & 0xfffffffe;
        (Instrux->field_73).Rex = (ND_REX)0x0;
        Instrux->Exs = (anon_struct_4_18_63b3064b_for_Exs)((uint)Instrux->Exs & 0xfffffff0);
      }
      bVar38 = bVar38 + 1;
      bVar45 = Instrux->Length + 1;
      Instrux->Length = bVar45;
    } while (bVar45 < 0x10);
LAB_0015de7d:
    NVar18 = 0x80000003;
    goto LAB_0015ab36;
  }
LAB_0015b438:
  switch(uVar25 & 3) {
  case 0:
    uVar30 = (uVar25 & 0xfffffc3f | *(uint *)&Instrux->field_0x5 & 0x40) +
             (*(uint *)&Instrux->field_0x5 & 0x20) * 8;
    break;
  case 1:
    uVar30 = (uVar25 & 0xfffffc3f | *(uint *)&Instrux->field_0x5 & 0x40) +
             (*(uint *)&Instrux->field_0x5 & 0x20) * 8 ^ 0x140;
    break;
  case 2:
    iVar31 = 0x200;
    if (((uint)Instrux->Exs & 1) == 0) {
      iVar31 = (~*(uint *)&Instrux->field_0x5 & 0x20) << 3;
    }
    uVar30 = iVar31 + 0x40 +
             (uVar25 & 0xfffffc3f | (uint)((*(uint *)&Instrux->field_0x5 & 0x40) == 0) << 6);
    break;
  case 3:
    goto switchD_0015b44b_caseD_3;
  }
  *(uint *)Instrux = uVar30;
  switch(uVar30 >> 0x10 & 0xf) {
  case 0:
    if (*(char *)((long)&Instrux->field_73 + 1) < '\0') {
      pNVar32 = &gLegacyMap_opcode_0f_opcode;
    }
    else {
      pNVar32 = &gLegacyMap_opcode;
    }
    goto LAB_0015b521;
  case 1:
    pNVar33 = &gXopMap_mmmmm;
    break;
  case 2:
    pNVar33 = &gVexMap_mmmmm;
    break;
  case 3:
    pNVar33 = &gEvexMap_mmmmm;
    break;
  default:
    pNVar32 = (ND_TABLE_OPCODE *)0x0;
    goto LAB_0015b521;
  }
  pNVar32 = (ND_TABLE_OPCODE *)pNVar33->Table[(uint)Instrux->Exs >> 9 & 0x1f];
LAB_0015b521:
  bVar36 = true;
  uVar47 = 0;
  local_a8 = (ushort *)0x0;
  bVar50 = false;
  bVar51 = false;
  NVar17 = 0;
switchD_0015b585_default:
  NVar18 = NVar17;
  pNVar34 = pNVar32;
  if ((!bVar36) || (pNVar34 == (ND_TABLE_OPCODE *)0x0)) goto LAB_0015ba1a;
  bVar36 = false;
  pNVar32 = pNVar34;
  NVar17 = 0x80000200;
  switch(pNVar34->Type) {
  case 0:
    local_a8 = (ushort *)pNVar34->Table[0];
    bVar36 = false;
    NVar17 = NVar18;
    goto switchD_0015b585_default;
  case 1:
    NVar12 = Instrux->Length;
    goto LAB_0015b731;
  case 2:
    NVar12 = Instrux->Length;
    if ((Instrux->field_0x6 & 8) == 0) {
      NVar17 = NdFetchModrmSibDisplacement(Instrux,Code_00,NVar12,Size);
      bVar36 = false;
      if ((int)NVar17 < 0) goto switchD_0015b585_default;
      NVar12 = Instrux->Length;
    }
LAB_0015b731:
    NVar17 = NdFetchOpcode(Instrux,Code_00,NVar12,Size);
    bVar36 = false;
    if (-1 < (int)NVar17) {
      pNVar4 = Instrux->OpCodeBytes + uVar47;
      uVar47 = (ulong)((int)uVar47 + 1);
      bVar36 = true;
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[*pNVar4];
      NVar17 = 0;
    }
    goto switchD_0015b585_default;
  case 3:
    if ((Instrux->field_0x6 & 8) == 0) {
      NVar17 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size);
      NVar18 = 0;
      bVar36 = false;
      if ((int)NVar17 < 0) goto switchD_0015b585_default;
    }
    pNVar32 = *(ND_TABLE_OPCODE **)((long)pNVar34->Table + (ulong)((Instrux->ModRm).ModRm & 0x38));
    goto LAB_0015b978;
  case 4:
    if ((Instrux->field_0x6 & 8) == 0) {
      NVar17 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size);
      NVar18 = 0;
      bVar36 = false;
      if ((int)NVar17 < 0) goto switchD_0015b585_default;
    }
    uVar26 = (ulong)(0xbf < (Instrux->ModRm).ModRm);
    break;
  case 5:
    if ((Instrux->field_0x6 & 8) == 0) {
      NVar17 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size);
      NVar18 = 0;
      bVar36 = false;
      if ((int)NVar17 < 0) goto switchD_0015b585_default;
    }
    uVar26 = (ulong)((Instrux->ModRm).ModRm & 7);
    break;
  case 6:
    if (Instrux->Rep == 0xf2 && !bVar50) {
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[3];
      *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 | 1;
      bVar50 = true;
      bVar36 = true;
      NVar17 = NVar18;
    }
    else {
      if (Instrux->Rep != 0xf3 || bVar51) {
        if ((*(uint *)&Instrux->field_0x5 & 0x20) == 0) goto LAB_0015b962;
        pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[1];
        *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 0x80000000;
        goto LAB_0015b978;
      }
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[2];
      *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 | 2;
      bVar51 = true;
      bVar36 = true;
      NVar17 = NVar18;
    }
    goto switchD_0015b585_default;
  case 7:
    uVar26 = (ulong)(*(uint *)Instrux & 3);
    goto LAB_0015b94f;
  case 8:
    if ((*(uint *)Instrux & 3) == 2) {
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[4];
      if ((pNVar32 != (ND_TABLE_OPCODE *)0x0) &&
         ((bVar36 = true, NVar17 = NVar18, (Instrux->field_0x5 & 0x20) == 0 ||
          (bVar36 = true, ((uint)Instrux->Exs & 1) != 0)))) goto switchD_0015b585_default;
      bVar36 = true;
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[5];
      NVar17 = NVar18;
      if ((ND_TABLE_OPCODE *)pNVar34->Table[5] != (ND_TABLE_OPCODE *)0x0)
      goto switchD_0015b585_default;
    }
    uVar26 = (ulong)(*(uint *)Instrux >> 8 & 3);
    goto LAB_0015b94f;
  case 9:
    uVar26 = (ulong)(*(uint *)Instrux >> 6 & 3);
LAB_0015b94f:
    pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[uVar26 + 1];
LAB_0015b954:
    bVar36 = true;
    NVar17 = NVar18;
    if (pNVar32 != (ND_TABLE_OPCODE *)0x0) goto switchD_0015b585_default;
    goto LAB_0015b962;
  case 10:
    if (((uint)Instrux->Exs & 0x48) != 0) {
      bVar36 = true;
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[1];
      NVar17 = NVar18;
      if ((ND_TABLE_OPCODE *)pNVar34->Table[1] != (ND_TABLE_OPCODE *)0x0)
      goto switchD_0015b585_default;
    }
    if (((uint)Instrux->Exs & 1) != 0) {
      bVar36 = true;
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[2];
      NVar17 = NVar18;
      if ((ND_TABLE_OPCODE *)pNVar34->Table[2] != (ND_TABLE_OPCODE *)0x0)
      goto switchD_0015b585_default;
    }
    if ((*(uint *)Instrux & 3) == 2) {
      bVar36 = true;
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[3];
      NVar17 = NVar18;
      if ((ND_TABLE_OPCODE *)pNVar34->Table[3] != (ND_TABLE_OPCODE *)0x0)
      goto switchD_0015b585_default;
    }
    if (Instrux->Rep != '\0') {
      if (Instrux->Rep == 0xf3) {
        bVar36 = true;
        pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[4];
        NVar17 = NVar18;
        if ((ND_TABLE_OPCODE *)pNVar34->Table[4] != (ND_TABLE_OPCODE *)0x0)
        goto switchD_0015b585_default;
      }
      bVar36 = true;
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[5];
      NVar17 = NVar18;
      if ((ND_TABLE_OPCODE *)pNVar34->Table[5] != (ND_TABLE_OPCODE *)0x0)
      goto switchD_0015b585_default;
    }
    if (((*(uint *)&Instrux->field_0x5 >> 0xb & 1) != 0 && (*(uint *)Instrux & 3) == 2) &&
       (((Instrux->ModRm).ModRm & 199) == 5)) {
      bVar36 = true;
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[6];
      NVar17 = NVar18;
      if ((ND_TABLE_OPCODE *)pNVar34->Table[6] != (ND_TABLE_OPCODE *)0x0)
      goto switchD_0015b585_default;
    }
    if ((*(uint *)&Instrux->field_0x5 & 2) != 0) {
      bVar36 = true;
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[7];
      NVar17 = NVar18;
      if ((ND_TABLE_OPCODE *)pNVar34->Table[7] == (ND_TABLE_OPCODE *)0x0) {
        if (((uint)Instrux->field_73 & 0x800) != 0) {
          pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[8];
          goto LAB_0015b954;
        }
        goto LAB_0015b962;
      }
      goto switchD_0015b585_default;
    }
LAB_0015b962:
    pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[0];
    goto LAB_0015b978;
  case 0xb:
    pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[*(uint *)Instrux >> 0x1c];
    goto LAB_0015b954;
  case 0xc:
    if ((((((ND_TABLE_OPCODE *)pNVar34->Table[1] == (ND_TABLE_OPCODE *)0x0) ||
          (bVar36 = true, pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[1], NVar17 = NVar18,
          (Instrux->FeatMode & 1) == 0)) &&
         (((ND_TABLE_OPCODE *)pNVar34->Table[2] == (ND_TABLE_OPCODE *)0x0 ||
          (bVar36 = true, pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[2], NVar17 = NVar18,
          (Instrux->FeatMode & 2) == 0)))) &&
        (((ND_TABLE_OPCODE *)pNVar34->Table[3] == (ND_TABLE_OPCODE *)0x0 ||
         (bVar36 = true, pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[3], NVar17 = NVar18,
         (Instrux->FeatMode & 4) == 0)))) &&
       (((ND_TABLE_OPCODE *)pNVar34->Table[4] == (ND_TABLE_OPCODE *)0x0 ||
        (bVar36 = true, pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[4], NVar17 = NVar18,
        (Instrux->FeatMode & 8) == 0)))) goto LAB_0015b962;
    goto switchD_0015b585_default;
  case 0xd:
    uVar23 = 0x509;
    goto LAB_0015b96d;
  case 0xe:
    uVar23 = 0x207;
    goto LAB_0015b96d;
  case 0xf:
    aVar40 = Instrux->Exs;
    if (((*(uint *)&Instrux->field_0x5 & 0x10) != 0) &&
       (((uint)aVar40 >> 0x15 & 1) != 0 && ((uint)aVar40 & 0x3e00) != 0x800)) {
      if ((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0) {
        NVar17 = NdFetchModrmSibDisplacement(Instrux,Code_00,Instrux->Length,Size);
        NVar18 = 0;
        bVar36 = false;
        if ((int)NVar17 < 0) goto switchD_0015b585_default;
      }
      if ((Instrux->ModRm).ModRm < 0xc0) {
        uVar23 = 0x20e;
        goto LAB_0015b96d;
      }
      bVar36 = true;
      pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[2];
      NVar17 = NVar18;
      if ((ND_TABLE_OPCODE *)pNVar34->Table[2] == (ND_TABLE_OPCODE *)0x0) {
        pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[1];
        goto LAB_0015b954;
      }
      goto switchD_0015b585_default;
    }
    uVar26 = (ulong)((uint)aVar40 >> 0xe & 3);
    break;
  case 0x10:
switchD_0015b585_caseD_10:
    uVar26 = (ulong)((uint)Instrux->Exs & 1);
    break;
  case 0x11:
    if (((undefined1  [488])*Instrux & (undefined1  [488])0x3) == (undefined1  [488])0x2)
    goto switchD_0015b585_caseD_10;
    uVar26 = 0;
    break;
  case 0x12:
    uVar23 = 0x11a;
    goto LAB_0015b96d;
  case 0x13:
    uVar23 = 0x11b;
LAB_0015b96d:
    uVar26 = (ulong)((uint)Instrux->Exs >> (sbyte)uVar23 & (1 << (sbyte)((ushort)uVar23 >> 8)) - 1U)
    ;
    break;
  case 0x14:
    uVar26 = (ulong)((uint)Instrux->Exs >> 0x1c);
    break;
  default:
    goto switchD_0015b585_default;
  }
  pNVar32 = (ND_TABLE_OPCODE *)pNVar34->Table[uVar26];
LAB_0015b978:
  bVar36 = true;
  NVar17 = NVar18;
  goto switchD_0015b585_default;
LAB_0015b231:
  NVar18 = 0x80000001;
  goto LAB_0015ab36;
LAB_0015ba1a:
  if ((int)NVar18 < 0) goto LAB_0015ab36;
  if (local_a8 != (ushort *)0x0) {
    if (((*(ulong *)(local_a8 + 0x14) & 1) != 0) && ((*(uint *)&Instrux->field_0x5 >> 0xb & 1) == 0)
       ) {
      bVar29 = Instrux->Length;
      if (((uint)*(ulong *)(local_a8 + 0x14) >> 0x11 & 1) == 0) {
        NVar18 = NdFetchModrmSibDisplacement(Instrux,Code_00,bVar29,Size);
        if ((int)NVar18 < 0) goto LAB_0015ab36;
      }
      else {
        NVar18 = 0x80000001;
        if (Size <= bVar29) goto LAB_0015ab36;
        *(uint *)&Instrux->field_0x5 = *(uint *)&Instrux->field_0x5 | 0x800;
        Instrux->ModRm = *(ND_MODRM *)(Instrux->InstructionBytes + bVar29);
        NVar18 = 0x80000003;
        *(ushort *)&Instrux->field_0x14 =
             *(ushort *)&Instrux->field_0x14 & 0xfff | (ushort)bVar29 << 0xc;
        Instrux->Length = bVar29 + 1;
        if (0xf < (byte)(bVar29 + 1)) goto LAB_0015ab36;
      }
    }
    uVar47 = *(ulong *)&Instrux->field_0xc;
    uVar30 = (uint)uVar47 >> 0xc & 0xf;
    Instrux->field_99 =
         *(anon_union_1_2_d70d35b6_for__INSTRUX_116 *)
          (Instrux->InstructionBytes + (ulong)uVar30 + 0xf);
    if ((Instrux->Attributes & 0x800) == 0) {
      NVar12 = (char)uVar30 + (char)(uVar47 >> 0x28);
    }
    else {
      NVar12 = Instrux->Length;
    }
    uVar20 = (ulong)(NVar12 - 1 & 0xf) << 0x2c;
    *(ulong *)&Instrux->field_0xc = uVar47 & 0xffff0fffffffffff | uVar20;
    Instrux->Mnemonic = gMnemonics[local_a8[2]];
    uVar26 = *(ulong *)(local_a8 + 0x14);
    Instrux->Attributes = uVar26;
    Instrux->Instruction = (uint)*local_a8;
    Instrux->Category = (uint)(byte)local_a8[1];
    Instrux->IsaSet = (uint)*(byte *)((long)local_a8 + 3);
    uVar30 = *(uint *)(local_a8 + 0x10) & *(uint *)(local_a8 + 0xe);
    (Instrux->FlagsAccess).Undefined.Raw = uVar30;
    (Instrux->FlagsAccess).Tested = *(ND_RFLAGS *)(local_a8 + 10);
    (Instrux->FlagsAccess).Modified = *(ND_RFLAGS *)(local_a8 + 0xc);
    (Instrux->FlagsAccess).Set.Raw = *(uint *)(local_a8 + 0xe) ^ uVar30;
    (Instrux->FlagsAccess).Cleared.Raw = uVar30 ^ *(uint *)(local_a8 + 0x10);
    Instrux->CpuidFlag = *(ND_CPUID_FLAG *)(local_a8 + 0x18);
    Instrux->ValidModes = *(ND_VALID_MODES *)(local_a8 + 4);
    Instrux->ValidPrefixes = *(ND_VALID_PREFIXES *)(local_a8 + 3);
    bVar29 = (byte)local_a8[6];
    (Instrux->ValidDecorators).Raw = bVar29;
    Instrux->FpuFlagsAccess = *(ND_FPU_FLAGS *)(local_a8 + 8);
    Instrux->SimdExceptions = *(ND_SIMD_EXCEPTIONS *)(local_a8 + 9);
    Instrux->ExceptionType = *(ND_UINT8 *)((long)local_a8 + 0xf);
    uVar49 = local_a8[7];
    Instrux->TupleType = (byte)uVar49;
    uVar30 = *(uint *)Instrux;
    uVar42 = (*(byte *)((long)local_a8 + 0x11) & 0xf) << 0x18;
    *(uint *)Instrux = uVar30 & 0xf0ffffff | uVar42;
    aVar40 = Instrux->Exs;
    uVar16 = (uint)uVar26;
    if (((uVar30 & 3) != 2) && ((uVar26 & 0x40000000) != 0)) {
      aVar40 = (anon_struct_4_18_63b3064b_for_Exs)((uint)aVar40 & 0xfffffffe);
      Instrux->Exs = aVar40;
    }
    bVar50 = (uVar26 & 2) != 0;
    if (bVar50) {
      bVar51 = (uVar26 & 4) == 0 && (uVar30 & 0xf0000000) != 0x20000000;
    }
    else {
      bVar51 = (uVar26 & 4) == 0;
    }
    uVar14 = *(uint *)&Instrux->field_0x5;
    if (((uVar14 & 0x20) == 0) || (bVar38 = 1, (uVar16 >> 0x13 & 1) == 0 && (int)uVar14 < 0)) {
      if (((uint)aVar40 & 0x180) == 0x80) {
        bVar38 = (byte)(uVar26 >> 0x24) & 1;
      }
      else {
        bVar38 = 0;
      }
    }
    switch(uVar30 & 3) {
    case 0:
      NVar18 = 0x80000009;
      if ((uVar26 & 8) != 0) goto LAB_0015ab36;
      break;
    case 1:
      NVar18 = 0x80000009;
      if ((uVar26 & 8) != 0) goto LAB_0015ab36;
      bVar38 = bVar38 ^ 1;
      break;
    case 2:
      NVar18 = 0x80000009;
      if ((uVar26 & 0x10) != 0) goto LAB_0015ab36;
      uVar15 = (uint)(bVar38 ^ 1) << 10;
      if (bVar50 && (uVar30 & 0xf0000000) != 0x20000000) {
        uVar15 = 0x800;
      }
      if (((uVar16 >> 10 & 1) == 0 & aVar40._0_1_) != 0) {
        uVar15 = 0x800;
      }
      uVar25 = 0x800;
      if (bVar38 != 0) {
        uVar25 = uVar15;
      }
      if (bVar51) {
        uVar25 = uVar15;
      }
      uVar15 = 0x80;
      if ((uVar16 >> 0x1c & 1) == 0) {
        uVar15 = uVar30 & 0xc0;
      }
      uVar25 = uVar15 | uVar30 & 0xf0fff33f | uVar42 | uVar25;
      goto LAB_0015bd47;
    case 3:
switchD_0015b44b_caseD_3:
      NVar18 = 0x80000101;
      goto LAB_0015ab36;
    }
    uVar25 = uVar30 & 0xf0fff3ff | uVar42 | (uint)bVar38 << 10;
LAB_0015bd47:
    *(uint *)Instrux = uVar25;
    *(ulong *)&Instrux->field_0xc =
         uVar47 & 0xffff0ffffffffff0 | uVar20 |
         (ulong)(*(byte *)((long)&NdParseOperand_wszLut + (ulong)(uVar25 >> 10 & 3)) & 0xf);
    if ((uVar14 & 0x10) != 0) {
      if ((uVar25 & 0xf000000) == 0) {
        if (((uint)Instrux->field_73 & 0x40000) == 0) {
          NVar18 = 0x80000046;
          if (((Instrux->ModRm).ModRm < 0xc0) || (((uint)aVar40 & 0x200000) == 0))
          goto LAB_0015ab36;
LAB_0015be78:
          if ((bVar29 & 1) == 0) {
            if ((bVar29 & 2) == 0) {
              NVar18 = 0x80000035;
              if ((uVar16 >> 0x1d & 1) == 0) goto LAB_0015ab36;
              uVar14 = uVar14 | 0x40000000;
              goto LAB_0015e1e4;
            }
            uVar14 = uVar14 | 0x4000000;
            *(uint *)&Instrux->field_0x5 = uVar14;
          }
          else {
            uVar14 = uVar14 | 0x6000000;
            *(uint *)&Instrux->field_0x5 = uVar14;
            *(ushort *)&Instrux->field_0x9 =
                 *(ushort *)&Instrux->field_0x9 & 0x9fff | (ushort)((uint)aVar40 >> 1) & 0x6000;
          }
        }
        else if (((uint)aVar40 >> 0x15 & 1) != 0) {
          if (0xbf < (Instrux->ModRm).ModRm) goto LAB_0015be78;
          NVar18 = 0x80000039;
          if ((bVar29 & 0x10) == 0) goto LAB_0015ab36;
          uVar14 = uVar14 | 0x400000;
LAB_0015e1e4:
          *(uint *)&Instrux->field_0x5 = uVar14;
        }
        if (((uint)aVar40 & 0x3800000) == 0) {
          NVar18 = 0x80000034;
          if ((uVar16 >> 0xd & 1) != 0) goto LAB_0015ab36;
        }
        else {
          NVar18 = 0x80000033;
          if ((bVar29 & 8) == 0) goto LAB_0015ab36;
          uVar14 = uVar14 | 0x800000;
          *(uint *)&Instrux->field_0x5 = uVar14;
        }
        if (((uint)aVar40 >> 0x16 & 1) != 0) {
          NVar18 = 0x80000036;
          if (((bVar29 & 4) == 0) || (NVar18 = 0x80000038, (uVar14 >> 0x17 & 1) == 0))
          goto LAB_0015ab36;
          uVar14 = uVar14 | 0x1000000;
          *(uint *)&Instrux->field_0x5 = uVar14;
        }
        uVar30 = 0x3ffffff;
        if (((uint)uVar47 & 0xf0000) == 0x10000 && (uVar14 >> 0xd & 1) != 0) {
          uVar14 = uVar14 | 0x200000;
          uVar30 = 0x3ffffff;
LAB_0015e3a7:
          *(uint *)&Instrux->field_0x5 = uVar14;
        }
      }
      else {
        if ((Instrux->FeatMode & 0x10) == 0) goto LAB_0015e2b7;
        NVar18 = 0x80000045;
        if (((*(byte *)((long)&Instrux->field_73 + 3) & (&DAT_001f70d0)[uVar25 >> 0x18 & 0xf]) != 0)
           || ((((uint)Instrux->field_73 & 0x40000) == 0 &&
               (NVar18 = 0x80000046, 0xbf < (Instrux->ModRm).ModRm)))) goto LAB_0015ab36;
        if ((bVar29 & 0x20) != 0) {
          uVar14 = (uVar14 & 0xf7ffffff) + ((uint)aVar40 & 0x4000000) * 2;
          *(uint *)&Instrux->field_0x5 = uVar14;
        }
        if ((bVar29 & 0x40) != 0) {
          uVar14 = (uVar14 & 0xefffffff) + ((uint)aVar40 & 0x8000000) * 2;
          *(uint *)&Instrux->field_0x5 = uVar14;
        }
        uVar30 = 0xfc1f3fff;
        if ((char)bVar29 < '\0') {
          uVar14 = (uVar14 & 0xdfffffff) + ((uint)aVar40 & 0x4000000) * 8;
          uVar30 = 0xfc1f3fff;
          goto LAB_0015e3a7;
        }
      }
      aVar40 = (anon_struct_4_18_63b3064b_for_Exs)((uint)aVar40 & uVar30);
      Instrux->Exs = aVar40;
    }
    if ((uVar16 >> 0x12 & 1) != 0) {
      if ((uVar14 & 0x46000000) == 0) {
        switch((uint)aVar40 >> 0xe & 3) {
        case 0:
          uVar25 = uVar25 & 0xffff0fff;
          break;
        case 1:
          uVar25 = (uVar25 & 0xffff0fff | (uVar16 & 0x200) << 5) ^ 0x5000;
          break;
        case 2:
          uVar25 = (uVar25 & 0xffff0fff | (uVar16 & 0x200) << 6) ^ 0xa000;
          break;
        case 3:
          NVar18 = 0x80000041;
          goto LAB_0015ab36;
        }
        *(uint *)Instrux = uVar25;
        if (((short)uVar26 < 0) && ((uVar25 & 0xc000) == 0)) goto LAB_0015e2b7;
      }
      else {
        uVar25 = uVar25 & 0xffff0fff;
        if (((byte)uVar49 & 0xfc) != 4) {
          if (((uint)Instrux->field_73 & 0x40000) == 0) {
            uVar25 = uVar25 | 0x5000;
          }
          else {
            uVar25 = uVar25 | 0xa000;
          }
        }
        *(uint *)Instrux = uVar25;
      }
    }
    bVar29 = *(byte *)((long)local_a8 + 0xd);
    bVar38 = bVar29 & 0xf | bVar29 << 4;
    Instrux->field_0x39 = bVar38;
    if ((Context->Options & 1) == 0) {
      bVar38 = (*(byte *)((long)local_a8 + 0xd) >> 4) + bVar29 & 0xf | bVar29 << 4;
      Instrux->field_0x39 = bVar38;
    }
    pNVar1 = Instrux->Operands;
    for (uVar47 = 0; uVar47 < (bVar38 & 0xf); uVar47 = uVar47 + 1) {
      aVar40 = Instrux->Exs;
      bVar29 = 1;
      if (((uint)aVar40 & 1) != 0) {
        bVar29 = (*(byte *)((long)&Instrux->Attributes + 1) & 4) >> 2;
      }
      uVar26 = *(ulong *)(local_a8 + uVar47 * 4 + 0x1c);
      bVar38 = Instrux->Length;
      uVar20 = (ulong)bVar38;
      Instrux->Operands[uVar47].Flags.Flags = (ND_UINT8)(uVar26 >> 0x10);
      bVar45 = (byte)(uVar26 >> 0x18);
      Instrux->Operands[uVar47].Access.Access = bVar45;
      uVar30 = (uint)(uVar26 >> 8) & 0xff;
      *(byte *)(pNVar1 + uVar47) = *(byte *)(pNVar1 + uVar47) & 0xf | 0xc0;
      puVar35 = &NdParseOperand_szLut_1919;
      uStack_c0 = 1;
      uVar42 = 4;
      switch(uVar30) {
      case 1:
      case 0x33:
        NVar12 = '\0';
        local_60 = 0;
        local_64 = 0;
        uStack_c0 = 0;
        goto LAB_0015c3c9;
      case 2:
        bVar22 = *(byte *)Instrux >> 6;
        goto LAB_0015c230;
      case 3:
        bVar22 = *(byte *)Instrux >> 4 & 3;
LAB_0015c230:
        uStack_c0 = (ulong)(uint)(2 << bVar22);
        break;
      case 4:
        if ((*(uint *)Instrux & 2) == 0) {
          uVar27 = (ulong)(*(uint *)Instrux >> 10 & 3);
          puVar35 = (undefined3 *)&NdParseOperand_szLut_1909;
          goto LAB_0015bfb0;
        }
        goto switchD_0015b44b_caseD_3;
      case 5:
        switch(*(uint *)Instrux & 3) {
        case 0:
          uStack_c0 = (ulong)(2 - ((Instrux->field_0x5 & 0x20) == 0));
          break;
        case 1:
          bVar50 = (Instrux->field_0x5 & 0x20) == 0;
          uStack_c0 = (ulong)(bVar50 + 2 + (uint)bVar50);
          break;
        case 2:
          goto switchD_0015bfa3_caseD_9;
        case 3:
          goto switchD_0015b44b_caseD_3;
        }
        break;
      case 6:
        break;
      case 7:
      case 0x14:
      case 0x1f:
        NVar12 = '\0';
        local_60 = 0;
        local_64 = 0;
        uStack_c0 = 2;
        goto LAB_0015c3c9;
      case 8:
      case 0x15:
      case 0x1e:
        goto LAB_0015c14d;
      case 9:
      case 0x16:
      case 0x1d:
switchD_0015bfa3_caseD_9:
        NVar12 = '\0';
        local_60 = 0;
        local_64 = 0;
        uStack_c0 = 8;
        goto LAB_0015c3c9;
      case 10:
        uVar42 = 0x10;
LAB_0015c14d:
        NVar12 = '\0';
        local_60 = 0;
        local_64 = 0;
        uStack_c0 = (ulong)uVar42;
        goto LAB_0015c3c9;
      case 0xb:
        uStack_c0 = 0x20;
        break;
      case 0xc:
      case 0x2b:
        uStack_c0 = 0x40;
        break;
      case 0xd:
        uVar23 = 0x20a;
        goto LAB_0015c242;
      case 0xe:
        uVar42 = *(uint *)Instrux >> 10;
        goto LAB_0015c29e;
      case 0xf:
        uVar42 = *(uint *)Instrux;
LAB_0015c29e:
        uStack_c0 = (ulong)*(byte *)((long)&NdParseOperand_szLut_1907 + (ulong)(uVar42 & 3));
        break;
      case 0x10:
        uVar23 = 0x20a;
        puVar35 = &NdParseOperand_szLut_1908;
        goto LAB_0015bfab;
      case 0x11:
        uVar42 = *(uint *)Instrux;
        puVar35 = &NdParseOperand_szLut_1911;
        goto LAB_0015c270;
      case 0x12:
        uVar23 = 0x20a;
        puVar35 = &NdParseOperand_szLut_1910;
        goto LAB_0015bfab;
      case 0x13:
      case 0x17:
        NVar12 = '\0';
        local_60 = 0;
        local_64 = 0;
        uStack_c0 = 10;
        goto LAB_0015c3c9;
      case 0x18:
        bVar22 = Instrux->field_0x1;
        uVar42 = 0xe;
        uStack_c0 = 0x1c;
        goto LAB_0015c329;
      case 0x19:
        bVar22 = Instrux->field_0x1;
        uVar42 = 0x5e;
        uStack_c0 = 0x6c;
LAB_0015c329:
        if ((bVar22 & 0xc) == 0) {
          uStack_c0 = (ulong)uVar42;
        }
        break;
      case 0x1a:
        uVar42 = *(uint *)Instrux;
        puVar35 = &NdParseOperand_szLut_1912;
LAB_0015c270:
        uVar27 = (ulong)(uVar42 & 3);
        goto LAB_0015bfb0;
      case 0x1b:
      case 0x2c:
        uStack_c0 = 0x200;
        break;
      case 0x1c:
        uStack_c0 = 0xfffffffffffffffe;
        break;
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x26:
      case 0x28:
        uVar23 = 0x20e;
        goto LAB_0015bfab;
      case 0x23:
        uVar23 = 0x20e;
LAB_0015c242:
        uVar27 = (ulong)(*(uint *)Instrux >> (sbyte)uVar23 &
                        (1 << (sbyte)((ushort)uVar23 >> 8)) - 1U);
        puVar35 = &NdParseOperand_wszLut;
        goto LAB_0015bfb0;
      case 0x24:
        uVar23 = 0x20e;
        puVar35 = &NdParseOperand_szLut_1917;
        goto LAB_0015bfab;
      case 0x25:
        uVar23 = 0x20e;
        puVar35 = &NdParseOperand_szLut_1918;
LAB_0015bfab:
        uVar27 = (ulong)(*(uint *)Instrux >> (sbyte)uVar23 &
                        (1 << (sbyte)((ushort)uVar23 >> 8)) - 1U);
LAB_0015bfb0:
        uStack_c0 = (ulong)*(byte *)(uVar27 + (long)puVar35);
        break;
      case 0x27:
        if ((*(uint *)Instrux & 0xc000) != 0) {
          uVar27 = (ulong)(*(uint *)Instrux >> 0xe & 3);
          puVar35 = &NdParseOperand_szLut_1915;
          goto LAB_0015bfb0;
        }
        goto switchD_0015b44b_caseD_3;
      case 0x29:
        uStack_c0 = 0x400;
        break;
      case 0x2a:
        uStack_c0 = 0x30;
        break;
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x30:
      case 0x31:
        iVar31 = (uint)(uVar30 != 0x30) * 3 + 5;
        if ((byte)(uVar30 - 0x2d) < 3) {
          iVar31 = (uVar30 - 0x2d & 0xff) + 2;
        }
        uStack_c0 = (ulong)((uint)*(byte *)((long)&NdParseOperand_wszLut +
                                           (ulong)(*(uint *)Instrux >> 10 & 3)) * iVar31);
        break;
      case 0x32:
        uStack_c0 = 0xc;
        break;
      case 0x34:
      case 0x35:
      case 0x36:
        uVar16 = (uint)aVar40 >> 0xe & 3;
        local_64 = (uint)(byte)((uVar16 != 1) * '\b' + 8);
        if (uVar16 == 0) {
          local_64 = uVar42;
        }
        NVar12 = (uVar30 != 0x35) * ' ' + ' ';
        if (uVar30 == 0x34) {
          NVar12 = '\x10';
        }
        goto LAB_0015c3b7;
      case 0x37:
        uVar42 = (uint)aVar40 >> 0xe & 3;
        local_64 = (uint)(byte)((uVar42 != 1) * '\x04' + 4);
        if (uVar42 == 0) {
          local_64 = 2;
        }
        NVar12 = (1 < uVar42) * '\x10' + '\x10';
        goto LAB_0015c3b7;
      case 0x38:
        uVar42 = (uint)aVar40 >> 0xe & 3;
        NVar12 = (uVar42 != 1) * ' ' + ' ';
        local_64 = (uint)(byte)((uVar42 != 1) * '\b' + 8);
        if (uVar42 == 0) {
          local_64 = 4;
          NVar12 = '\x10';
        }
LAB_0015c3b7:
        uVar42 = local_64 << (bVar29 ^ 3);
        local_60 = 4;
LAB_0015c3c6:
        uStack_c0 = (ulong)uVar42;
        goto LAB_0015c3c9;
      case 0x39:
      case 0x3a:
      case 0x3b:
        uVar42 = (uint)aVar40 >> 0xe & 3;
        local_64 = (uint)(byte)((uVar42 != 1) * '\x04' + 4);
        if (uVar42 == 0) {
          local_64 = 2;
        }
        NVar12 = (uVar30 != 0x3a) * ' ' + ' ';
        bVar50 = uVar30 == 0x39;
        goto LAB_0015c195;
      case 0x3c:
        uVar42 = (uint)aVar40 >> 0xe & 3;
        local_64 = (uint)(byte)((uVar42 != 1) * '\x02' + 2);
        if (uVar42 == 0) {
          local_64 = 1;
        }
        NVar12 = (1 < uVar42) * '\x10' + '\x10';
        goto LAB_0015c1a4;
      case 0x3d:
        uVar42 = (uint)aVar40 >> 0xe & 3;
        NVar12 = (uVar42 != 1) * ' ' + ' ';
        bVar50 = uVar42 == 0;
        local_64 = (uint)(byte)((uVar42 != 1) * '\x04' + 4);
        if (bVar50) {
          local_64 = 2;
        }
LAB_0015c195:
        if (bVar50) {
          NVar12 = '\x10';
        }
LAB_0015c1a4:
        uVar42 = local_64 << (bVar29 ^ 3);
        local_60 = 8;
        goto LAB_0015c3c6;
      case 0x3e:
        uStack_c0 = 0xffffffffffffffff;
        break;
      default:
        goto switchD_0015b44b_caseD_3;
      }
      NVar12 = '\0';
      local_60 = 0;
      local_64 = 0;
LAB_0015c3c9:
      pNVar46 = pNVar1 + uVar47;
      uVar42 = (uint)uStack_c0;
      pNVar46->Size = uVar42;
      if (0x69 < (byte)uVar26) goto switchD_0015b44b_caseD_3;
      uVar27 = uVar26 >> 0x20;
      uVar16 = (uint)uVar26 & 0xff;
      local_80 = aVar40._0_1_;
      bVar22 = (byte)uStack_c0;
      switch(uVar26 & 0xff) {
      case 0:
        uVar48 = (uStack_c0 & 0xff) + uVar20;
        uVar42 = (uint)(uStack_c0 & 0xff);
        if (uVar30 == 0x12) {
          if (Size < uVar48) goto LAB_0015b231;
          Instrux->field_0x6 = Instrux->field_0x6 | 0x40;
          uVar48 = (ulong)(bVar38 & 0xf) << 0x34 | (ulong)((uVar42 & 0xf) << 0x14) |
                   *(ulong *)&Instrux->field_0xc & 0xff0fffffff0fffff;
          *(ulong *)&Instrux->field_0xc = uVar48;
          NVar21 = NdFetchData(Code_00 + uVar20,(bVar22 & 0xf) - 2);
          uVar48 = uVar48 >> 0x14;
          (Instrux->field_74).Displacement = (ND_UINT32)NVar21;
          NVar5 = *(ND_UINT16 *)(Code_00 + uVar20 + ((ulong)((uint)uVar48 & 0xf) - 2));
          bVar38 = ((byte)uVar48 & 0xf) + bVar38;
          (Instrux->field_74).Address.Cs = NVar5;
          Instrux->Length = bVar38;
          if (0xf < bVar38) goto LAB_0015de7d;
          *(byte *)pNVar46 = 0x45;
          (pNVar46->Info).Address.BaseSeg = NVar5;
          uVar20 = NVar21 & 0xffffffff;
        }
        else {
          if (Size < uVar48) goto LAB_0015b231;
          Instrux->field_0x6 = Instrux->field_0x6 | 0x80;
          *(ulong *)&Instrux->field_0xc =
               (ulong)(bVar38 & 0xf) << 0x34 | (ulong)((uVar42 & 0xf) << 0x14) |
               *(ulong *)&Instrux->field_0xc & 0xff0fffffff0fffff;
          uVar20 = NdFetchData(Code_00 + uVar20,bVar22 & 0xf);
          bVar38 = (bVar22 & 0xf) + bVar38;
          (Instrux->field_74).Moffset = uVar20;
          Instrux->Length = bVar38;
          if (0xf < bVar38) goto LAB_0015de7d;
          *(byte *)pNVar46 = 0x46;
        }
LAB_0015d9c7:
        (pNVar46->Info).Immediate.Imm = uVar20;
        break;
      case 1:
        *(byte *)pNVar46 = 0x31;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        (pNVar46->Info).Register.Size = uVar42;
        NVar19 = (uint)aVar40 >> 0x10 & ND_REG_X87;
        (pNVar46->Info).Register.Reg = NVar19;
        if (((uint)aVar40 >> 0x14 & 1) == 0) break;
        if ((Instrux->FeatMode & 0x10) == 0) goto LAB_0015e05d;
        NVar19 = NVar19 | ND_REG_MXCSR;
        goto LAB_0015d62f;
      case 2:
        *(byte *)pNVar46 = 0x11;
        (pNVar46->Info).Register.Type = ND_REG_CR;
        (pNVar46->Info).Register.Size = uVar42;
        uVar30 = (Instrux->ModRm).ModRm >> 3 & 7 | ((uint)aVar40 & 0x10) + ((uint)aVar40 & 2) * 4;
        (pNVar46->Info).Register.Reg = uVar30;
        if ((((undefined1  [488])*Instrux & (undefined1  [488])0x3) != (undefined1  [488])0x2) &&
           ((Instrux->field_0x5 & 0x80) != 0)) {
          uVar30 = uVar30 | 8;
          (pNVar46->Info).Register.Reg = uVar30;
        }
        NVar18 = 0x80000005;
        if ((8 < uVar30) || ((0x11dU >> (uVar30 & 0x1f) & 1) == 0)) goto LAB_0015ab36;
        break;
      case 3:
        *(byte *)pNVar46 = 0x11;
        (pNVar46->Info).Register.Type = ND_REG_DR;
        (pNVar46->Info).Register.Size = uVar42;
        uVar30 = ((uint)aVar40 & 0x10) + ((uint)aVar40 & 2) * 4;
        (pNVar46->Info).Register.Reg = (Instrux->ModRm).ModRm >> 3 & 7 | uVar30;
        if (uVar30 == 0) break;
        goto LAB_0015e05d;
      case 4:
        bVar38 = (Instrux->ModRm).ModRm;
        if (bVar38 < 0xc0) goto LAB_0015d425;
        *(byte *)pNVar46 = 0x21;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        (pNVar46->Info).Register.Size = uVar42;
        goto LAB_0015ca8c;
      case 5:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_FLG;
        (pNVar46->Info).Register.Size = uVar42;
        (pNVar46->Info).Register.Reg = 0;
        Instrux->RflAccess = Instrux->RflAccess | bVar45;
        break;
      case 6:
        *(byte *)pNVar46 = 0x11;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        (pNVar46->Info).Register.Size = uVar42;
        uVar30 = ((Instrux->ModRm).ModRm >> 3 & 7) + ((uint)aVar40 & 2) * 4;
        (pNVar46->Info).Register.Reg = uVar30;
        if (((uint)aVar40 & 0x10) != 0) {
          if ((Instrux->FeatMode & 0x10) == 0) goto LAB_0015e05d;
          uVar30 = uVar30 | 0x10;
          (pNVar46->Info).Register.Reg = uVar30;
        }
        goto joined_r0x0015d00d;
      case 7:
        *(byte *)pNVar46 = 0x31;
        (pNVar46->Info).Register.Type = ND_REG_SSE;
        uVar30 = 0x10;
        if (0x10 < uVar42) {
          uVar30 = uVar42;
        }
        (pNVar46->Info).Register.Size = uVar30;
        uVar23 = 0x510;
        goto LAB_0015d24a;
      case 8:
        if (Size < (uStack_c0 & 0xff) + uVar20) goto LAB_0015b231;
        NVar21 = NdFetchData(Code_00 + uVar20,bVar22);
        uVar30 = *(uint *)&Instrux->field_0x5;
        if ((uVar30 >> 0x13 & 1) != 0) goto switchD_0015b44b_caseD_3;
        if ((uVar30 >> 0x12 & 1) == 0) {
          uVar30 = uVar30 | 0x40000;
          Instrux->Immediate1 = NVar21;
          uVar20 = *(ulong *)&Instrux->field_0xc & 0xfffffff0fffffff | (ulong)((uint)bVar22 << 0x1c)
                   | uVar20 << 0x3c;
        }
        else {
          uVar30 = uVar30 | 0x80000;
          uVar20 = *(ulong *)&Instrux->field_0xc & 0xfffffff0ffffffff |
                   (ulong)(bVar22 & 0xf) << 0x20;
          *(ushort *)&Instrux->field_0x14 =
               (ushort)*(undefined4 *)&Instrux->field_0x14 & 0xfff0 | bVar38 & 0xf;
          (Instrux->field_76).Immediate2 = (ND_UINT8)NVar21;
        }
        *(uint *)&Instrux->field_0x5 = uVar30;
        *(ulong *)&Instrux->field_0xc = uVar20;
        Instrux->Length = bVar38 + bVar22;
        if (0xf < (byte)(bVar38 + bVar22)) goto LAB_0015de7d;
        if ((uVar30 >> 0x13 & 1) == 0) {
          uVar20 = Instrux->Immediate1;
        }
        else {
          uVar20 = (ulong)(Instrux->field_76).Immediate2;
        }
        *(byte *)pNVar46 = 99;
        (pNVar46->Info).Immediate.RawSize = bVar22;
        if ((uVar26 >> 0x10 & 4) == 0) {
          if ((uVar26 >> 0x10 & 2) == 0) goto LAB_0015d9c7;
          uVar30 = Instrux->Operands[0].Size;
        }
        else {
          uVar30 = (uint)*(byte *)((long)&NdParseOperand_wszLut +
                                  (ulong)(*(uint *)Instrux >> 10 & 3));
        }
        pNVar46->Size = uVar30;
        bVar29 = (byte)(uVar42 << 3);
        sVar10 = (bVar29 < 0x41) * ('@' - bVar29);
        sVar11 = (bVar29 < 0x41) * ('@' - bVar29);
        uVar48 = 0;
        if ((uVar20 >> ((ulong)(byte)(bVar29 - 1) & 0x3f) & 1) != 0) {
          uVar48 = ~((ulong)(-1L << sVar10) >> sVar10);
        }
        (pNVar46->Info).Immediate.Imm = uVar48 | (uVar20 << sVar11) >> sVar11;
        break;
      case 9:
        if (Size < (uStack_c0 & 0xff) + uVar20) goto LAB_0015b231;
        Instrux->field_0x7 = Instrux->field_0x7 | 2;
        uVar48 = *(ulong *)&Instrux->field_0xc;
        *(ulong *)&Instrux->field_0xc =
             uVar48 & 0xffffff0fffffffff | (ulong)((uint)(uStack_c0 & 0xff) & 0xf) << 0x24;
        *(ushort *)&Instrux->field_0x14 =
             (ushort)*(undefined4 *)&Instrux->field_0x14 & 0xff0f | (ushort)(byte)(bVar38 << 4);
        NVar21 = NdFetchData(Code_00 + uVar20,bVar22);
        uVar30 = (uint)NVar21;
        (Instrux->field_74).Displacement = uVar30;
        Instrux->Length = bVar38 + bVar22;
        if (0xf < (byte)(bVar38 + bVar22)) goto LAB_0015de7d;
        Instrux->field_0xa = Instrux->field_0xa | 0x10;
        *(byte *)pNVar46 = 0x44;
        pNVar46->Size = (uint)uVar48 & 0xf;
        bVar29 = (byte)(uVar42 << 3);
        sVar11 = (bVar29 < 0x41) * ('@' - bVar29);
        sVar10 = (bVar29 < 0x21) * (' ' - bVar29);
        (pNVar46->Info).Immediate.Imm =
             (ulong)(uVar30 >> ((byte)(bVar29 - 1) & 0x1f) & 1) *
             ~((ulong)(-1L << sVar11) >> sVar11) | (ulong)((uVar30 << sVar10) >> sVar10);
        (pNVar46->Info).Immediate.RawSize = bVar22;
        break;
      case 10:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0xc2;
        (pNVar46->Info).Memory.BaseSize =
             *(ND_UINT8 *)((long)&NdParseOperand_wszLut + (ulong)(*(uint *)Instrux >> 4 & 3));
        *(ushort *)&pNVar46->Info = *(ushort *)&pNVar46->Info | 0x83;
        *(undefined1 *)((long)&pNVar46->Info + 10) = 0x22;
        *(ulong *)&Instrux->field_0xc =
             *(ulong *)&Instrux->field_0xc & 0xffffffffffffff0f |
             (ulong)((pNVar46->Size / ((uint)*(ulong *)&Instrux->field_0xc & 0xf) & 0xf) << 4);
        Instrux->StackAccess = Instrux->StackAccess | bVar45;
        break;
      case 0xb:
        if (Size <= uVar20) goto LAB_0015b231;
        Instrux->field_0x7 = Instrux->field_0x7 | 0x10;
        *(ushort *)&Instrux->field_0x14 =
             (ushort)*(undefined4 *)&Instrux->field_0x14 & 0xf0ff | (bVar38 & 0xf) << 8;
        bVar29 = Instrux->InstructionBytes[uVar20];
        (Instrux->field_76).Immediate2 = bVar29;
        Instrux->Length = bVar38 + 1;
        if (0xf < (byte)(bVar38 + 1)) goto LAB_0015de7d;
        *(byte *)pNVar46 = 0x91;
        (pNVar46->Info).Register.Type = ND_REG_SSE;
        uVar30 = 0x10;
        if (0x10 < uVar42) {
          uVar30 = uVar42;
        }
        NVar19 = (ND_REG_TYPE)(bVar29 >> 4);
        (pNVar46->Info).Register.Size = uVar30;
        (pNVar46->Info).Register.Reg = NVar19;
        if (((undefined1  [488])*Instrux & (undefined1  [488])0x3) != (undefined1  [488])0x2)
        goto LAB_0015cfb6;
        break;
      case 0xc:
        bVar38 = (Instrux->ModRm).ModRm;
        if (bVar38 < 0xc0) goto LAB_0015d425;
        goto LAB_0015e2b7;
      case 0xd:
        NVar19 = (ND_REG_TYPE)(Instrux->ModRm).ModRm;
        if (0xbf < NVar19) {
          *(byte *)pNVar46 = 0x21;
          (pNVar46->Info).Immediate.Imm = 0x800000004;
          goto LAB_0015cfb6;
        }
        goto LAB_0015e2b7;
      case 0xe:
        lVar41 = 2L << (*(byte *)Instrux >> 6);
        if (lVar41 + uVar20 <= Size) {
          Instrux->field_0x7 = Instrux->field_0x7 | 1;
          uVar30 = (uint)lVar41 & 0xe;
          *(ulong *)&Instrux->field_0xc =
               (ulong)(bVar38 & 0xf) << 0x38 | *(ulong *)&Instrux->field_0xc & 0xf0fffffff0ffffff |
               (ulong)(uVar30 << 0x18);
          NVar21 = NdFetchData(Code_00 + uVar20,(ND_UINT8)lVar41);
          (Instrux->field_74).Moffset = NVar21;
          bVar38 = (ND_UINT8)lVar41 + bVar38;
          Instrux->Length = bVar38;
          if (bVar38 < 0x10) {
            Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
            *(byte *)pNVar46 = 0x42;
            (pNVar46->Info).Memory.DispSize = (ND_UINT8)uVar30;
            (pNVar46->Info).Memory.Disp = NVar21;
            *(ushort *)&pNVar46->Info = *(ushort *)&pNVar46->Info | 0x409;
            bVar29 = NdGetSegOverride(Instrux,'\x03');
            bVar29 = *(byte *)((long)&pNVar46->Info + 10) & 0xf8 | bVar29;
            goto LAB_0015c9c5;
          }
          goto LAB_0015de7d;
        }
        goto LAB_0015b231;
      case 0xf:
        *(byte *)pNVar46 = 0x11;
        (pNVar46->Info).Immediate.Imm = 0x800000004;
        goto LAB_0015d621;
      case 0x10:
        bVar38 = (Instrux->ModRm).ModRm;
        if (bVar38 < 0xc0) goto LAB_0015d425;
        *(byte *)pNVar46 = 0x21;
        (pNVar46->Info).Immediate.Imm = 0x800000004;
LAB_0015d1f6:
        (pNVar46->Info).Register.Reg = bVar38 & 7;
        break;
      case 0x11:
        bVar29 = (Instrux->ModRm).ModRm;
        if ((bVar29 < 0xc0) && ((Instrux->Attributes & 0x20000) == 0)) goto LAB_0015e2b7;
        *(byte *)pNVar46 = 0x21;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        (pNVar46->Info).Register.Size = uVar42;
        uVar30 = bVar29 & 7 | (uint)aVar40 & 8;
        (pNVar46->Info).Register.Reg = uVar30;
        if (((uint)aVar40 & 0x40) != 0) {
          if ((Instrux->FeatMode & 0x10) == 0) goto LAB_0015e05d;
          uVar30 = uVar30 | 0x10;
          (pNVar46->Info).Register.Reg = uVar30;
        }
        bVar50 = false;
        if ((uVar42 == 1) && (3 < uVar30)) {
          if (((Instrux->field_0x2 & 0xf) == 0) && ((*(uint *)&Instrux->field_0x5 & 1) == 0)) {
            bVar50 = (*(uint *)&Instrux->field_0x5 & 2) == 0;
          }
          else {
            bVar50 = false;
          }
        }
        *(byte *)((long)&pNVar46->Info + 0xd) =
             *(byte *)((long)&pNVar46->Info + 0xd) & 0xfe | bVar50;
        break;
      case 0x12:
        *(byte *)pNVar46 = 0x11;
        (pNVar46->Info).Register.Type = ND_REG_SEG;
        (pNVar46->Info).Register.Size = uVar42;
        uVar30 = (Instrux->ModRm).ModRm >> 3 & 7;
        (pNVar46->Info).Register.Reg = uVar30;
        bVar29 = (byte)uVar30;
        if (5 < bVar29) goto LAB_0015e05d;
        if (((uVar26 & 0x2000000) != 0) && (bVar29 == 1)) {
          NVar18 = 0x8000000b;
          goto LAB_0015ab36;
        }
        break;
      case 0x13:
        *(byte *)pNVar46 = 0x11;
        (pNVar46->Info).Register.Type = ND_REG_TR;
        (pNVar46->Info).Register.Size = uVar42;
        uVar30 = (int)aVar40 * 4 & 8;
        (pNVar46->Info).Register.Reg = (Instrux->ModRm).ModRm >> 3 & 7 | uVar30;
        if (uVar30 != 0) goto LAB_0015e05d;
        break;
      case 0x14:
        bVar29 = (Instrux->ModRm).ModRm;
        if (bVar29 < 0xc0) goto LAB_0015e2b7;
        *(byte *)pNVar46 = 0x21;
        (pNVar46->Info).Register.Type = ND_REG_SSE;
        uVar30 = 0x10;
        if (0x10 < uVar42) {
          uVar30 = uVar42;
        }
        (pNVar46->Info).Register.Size = uVar30;
        bVar29 = local_80 & 8 | bVar29 & 7;
LAB_0015d28d:
        (pNVar46->Info).Register.Reg = (uint)bVar29;
        if ((Instrux->field_0x5 & 0x10) != 0) {
          NVar19 = (uint)bVar29 + ((uint)aVar40 & 4) * 4;
          goto LAB_0015d62f;
        }
        break;
      case 0x15:
        *(byte *)pNVar46 = 0x11;
        (pNVar46->Info).Register.Type = ND_REG_SSE;
        uVar30 = 0x10;
        if (0x10 < uVar42) {
          uVar30 = uVar42;
        }
        (pNVar46->Info).Register.Size = uVar30;
        uVar16 = ((Instrux->ModRm).ModRm >> 3 & 7) + ((uint)aVar40 & 2) * 4;
        (pNVar46->Info).Register.Reg = uVar16;
        if ((Instrux->field_0x5 & 0x10) != 0) {
          uVar16 = (uint)aVar40 & 0x10 | uVar16;
          goto LAB_0015c45f;
        }
        break;
      case 0x16:
        bVar38 = (Instrux->ModRm).ModRm;
        if (0xbf < bVar38) {
          *(byte *)pNVar46 = 0x21;
          (pNVar46->Info).Register.Type = ND_REG_SSE;
          uVar30 = 0x10;
          if (0x10 < uVar42) {
            uVar30 = uVar42;
          }
          (pNVar46->Info).Register.Size = uVar30;
          bVar29 = local_80 & 8 | bVar38 & 7;
          goto LAB_0015d28d;
        }
        goto LAB_0015d425;
      case 0x17:
      case 0x18:
      case 0x4b:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0xc2;
        (pNVar46->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
        bVar38 = (uVar16 != 0x17) << 3 | 0x30;
        *(byte *)((long)&pNVar46->Info + 10) = *(byte *)((long)&pNVar46->Info + 10) & 7 | bVar38;
        *(ushort *)&pNVar46->Info =
             (ushort)(uVar16 - 0x17 < 2) << 8 | (ushort)(pNVar46->Info).Register.Type & 0xfefc | 3;
        if (uVar16 != 0x18) goto LAB_0015c887;
        *(undefined1 *)((long)&pNVar46->Info + 10) = 0x38;
        break;
      case 0x19:
        *(byte *)pNVar46 = 0x51;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        (pNVar46->Info).Register.Size = uVar42;
        bVar38 = (Instrux->field_99).PrimaryOpCode;
LAB_0015ca8c:
        uVar30 = bVar38 & 7 | (uint)aVar40 & 8;
        (pNVar46->Info).Register.Reg = uVar30;
        if (((uint)aVar40 & 0x40) == 0) {
joined_r0x0015d00d:
          bVar50 = false;
          if ((uVar42 == 1) && (bVar50 = false, 3 < uVar30)) {
            if (((Instrux->field_0x2 & 0xf) == 0) && ((*(uint *)&Instrux->field_0x5 & 1) == 0)) {
              bVar50 = (*(uint *)&Instrux->field_0x5 & 2) == 0;
            }
            else {
              bVar50 = false;
            }
          }
          *(byte *)((long)&pNVar46->Info + 0xd) =
               *(byte *)((long)&pNVar46->Info + 0xd) & 0xfe | bVar50;
          break;
        }
        if ((Instrux->FeatMode & 0x10) != 0) {
          uVar30 = uVar30 | 0x10;
          (pNVar46->Info).Register.Reg = uVar30;
          goto joined_r0x0015d00d;
        }
        goto LAB_0015e05d;
      case 0x1a:
        *(byte *)pNVar46 = 0x11;
        (pNVar46->Info).Register.Type = ND_REG_BND;
        (pNVar46->Info).Register.Size = uVar42;
        uVar30 = ((Instrux->ModRm).ModRm >> 3 & 7) + ((uint)aVar40 & 2) * 4;
LAB_0015d414:
        (pNVar46->Info).Register.Reg = uVar30;
        if (3 < (byte)uVar30) goto LAB_0015e05d;
        break;
      case 0x1b:
        bVar38 = (Instrux->ModRm).ModRm;
        if (0xbf < bVar38) {
          *(byte *)pNVar46 = 0x21;
          (pNVar46->Info).Register.Type = ND_REG_BND;
          (pNVar46->Info).Register.Size = uVar42;
          uVar30 = (uint)(local_80 & 8 | bVar38 & 7);
          goto LAB_0015d414;
        }
        goto LAB_0015d425;
      case 0x1c:
        *(byte *)pNVar46 = 0x11;
        (pNVar46->Info).Register.Type = ND_REG_MSK;
        if (((uint)aVar40 & 0x12) != 0) goto LAB_0015e05d;
        (pNVar46->Info).Register.Size = 8;
LAB_0015d621:
        NVar19 = (Instrux->ModRm).ModRm >> 3 & ND_REG_DR;
        goto LAB_0015d62f;
      case 0x1d:
        *(byte *)pNVar46 = 0x31;
        (pNVar46->Info).Immediate.Imm = 0x80000000a;
        uVar30 = (uint)aVar40 >> 0x10 & 0xf;
        (pNVar46->Info).Register.Reg = uVar30;
        if (7 < uVar30) goto LAB_0015e05d;
        break;
      case 0x1e:
        bVar38 = (Instrux->ModRm).ModRm;
        if (0xbf < bVar38) {
          *(byte *)pNVar46 = 0x21;
          (pNVar46->Info).Immediate.Imm = 0x80000000a;
          goto LAB_0015d1f6;
        }
LAB_0015d425:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0x22;
        uVar49 = (ushort)(pNVar46->Info).Register.Type;
        uVar13 = uVar49 | 1;
        *(ushort *)&pNVar46->Info = uVar13;
        uVar30 = *(uint *)Instrux;
        uVar42 = uVar30 & 0xc0;
        if (uVar42 == 0) {
          if ((Instrux->Attributes & 0x10000) != 0) {
            NVar18 = 0x8000000d;
            goto LAB_0015ab36;
          }
          switch(bVar38 & 7) {
          case 0:
            uVar13 = uVar49 | 7;
            (pNVar46->Info).Register.Count = ((pNVar46->Info).Register.Count & 0xf0) + 1;
            *(undefined2 *)((long)&pNVar46->Info + 2) = 0x202;
            *(undefined2 *)((long)&pNVar46->Info + 10) = 0x61b;
            goto LAB_0015dafc;
          case 1:
            uVar13 = uVar49 | 7;
            (pNVar46->Info).Register.Count = ((pNVar46->Info).Register.Count & 0xf0) + 1;
            *(undefined2 *)((long)&pNVar46->Info + 2) = 0x202;
            *(undefined2 *)((long)&pNVar46->Info + 10) = 0x71b;
            goto LAB_0015dafc;
          case 2:
            uVar13 = uVar49 | 7;
            *(ushort *)&pNVar46->Info = uVar13;
            (pNVar46->Info).Register.Count = ((pNVar46->Info).Register.Count & 0xf0) + 1;
            *(undefined2 *)((long)&pNVar46->Info + 2) = 0x202;
            *(undefined2 *)((long)&pNVar46->Info + 10) = 0x62a;
            goto LAB_0015db41;
          case 3:
            uVar13 = uVar49 | 7;
            *(ushort *)&pNVar46->Info = uVar13;
            (pNVar46->Info).Register.Count = ((pNVar46->Info).Register.Count & 0xf0) + 1;
            *(undefined2 *)((long)&pNVar46->Info + 2) = 0x202;
            *(undefined2 *)((long)&pNVar46->Info + 10) = 0x72a;
LAB_0015db41:
            bVar45 = 0x2a;
            break;
          case 4:
            uVar13 = uVar49 | 3;
            bVar45 = 0x33;
            *(ushort *)&pNVar46->Info = uVar13;
            (pNVar46->Info).Memory.BaseSize = '\x02';
            *(undefined1 *)((long)&pNVar46->Info + 10) = 0x33;
            break;
          case 5:
            uVar13 = uVar49 | 3;
            bVar45 = 0x3b;
            *(ushort *)&pNVar46->Info = uVar13;
            (pNVar46->Info).Memory.BaseSize = '\x02';
            *(undefined1 *)((long)&pNVar46->Info + 10) = 0x3b;
            break;
          case 6:
            if (0x3f < bVar38) {
              uVar13 = uVar49 | 3;
              *(ushort *)&pNVar46->Info = uVar13;
              (pNVar46->Info).Memory.BaseSize = '\x02';
              *(undefined1 *)((long)&pNVar46->Info + 10) = 0x2a;
              goto LAB_0015db41;
            }
            bVar45 = *(byte *)((long)&pNVar46->Info + 10) & 0xf8 | 3;
            *(byte *)((long)&pNVar46->Info + 10) = bVar45;
            break;
          case 7:
            uVar13 = uVar49 | 3;
            (pNVar46->Info).Memory.BaseSize = '\x02';
            *(undefined1 *)((long)&pNVar46->Info + 10) = 0x1b;
LAB_0015dafc:
            bVar45 = 0x1b;
          }
          uVar42 = *(uint *)&Instrux->field_0x5;
        }
        else {
          NVar39 = (uVar42 != 0x40) * '\x04' + '\x04';
          bVar45 = *(byte *)((long)&pNVar46->Info + 10) & 0xf8 | 3;
          *(byte *)((long)&pNVar46->Info + 10) = bVar45;
          uVar42 = *(uint *)&Instrux->field_0x5;
          if ((uVar42 >> 0xc & 1) == 0) {
            if ((bVar38 & 199) == 5) {
              uVar30 = uVar30 & 3;
              uVar13 = uVar49 & 0xffbf | 1 | (ushort)(uVar30 == 2) << 6;
              *(ushort *)&Instrux->field_0x9 =
                   *(ushort *)&Instrux->field_0x9 & 0xefff | (ushort)(uVar30 == 2) << 0xc;
              *(ushort *)&pNVar46->Info = uVar13;
              if ((uVar30 != 2) || ((Instrux->Attributes & 0x2000000) == 0)) goto LAB_0015db4a;
              NVar18 = 0x8000000e;
              goto LAB_0015ab36;
            }
            uVar13 = uVar49 | 3;
            *(ushort *)&pNVar46->Info = uVar13;
            (pNVar46->Info).Memory.BaseSize = NVar39;
            bVar38 = (local_80 & 8 | bVar38 & 7) * '\b';
            bVar45 = bVar38 + 3;
            *(byte *)((long)&pNVar46->Info + 10) = bVar45;
            if (((uint)aVar40 & 0x40) != 0) {
              if ((Instrux->FeatMode & 0x10) == 0) {
LAB_0015e05d:
                NVar18 = 0x80000005;
                goto LAB_0015ab36;
              }
              bVar45 = bVar38 | 0x83;
              *(byte *)((long)&pNVar46->Info + 10) = bVar45;
            }
            if ((bVar45 & 0xf0) == 0x20) {
              bVar45 = bVar45 & 0x2a;
              *(byte *)((long)&pNVar46->Info + 10) = bVar45;
            }
          }
          else {
            bVar22 = (Instrux->Sib).Sib;
            if (0x3f < bVar38 || (bVar22 & 7) != 5) {
              uVar13 = uVar49 | 3;
              *(ushort *)&pNVar46->Info = uVar13;
              (pNVar46->Info).Memory.BaseSize = NVar39;
              bVar38 = (bVar22 & 7 | local_80 & 8) * '\b';
              bVar45 = bVar38 + 3;
              *(byte *)((long)&pNVar46->Info + 10) = bVar45;
              if (((uint)aVar40 & 0x40) != 0) {
                if ((Instrux->FeatMode & 0x10) == 0) goto LAB_0015e05d;
                bVar45 = bVar38 | 0x83;
                *(byte *)((long)&pNVar46->Info + 10) = bVar45;
              }
              if ((bVar45 & 0xf0) == 0x20) {
                bVar45 = bVar45 & 0x2a;
                *(byte *)((long)&pNVar46->Info + 10) = bVar45;
              }
            }
            if ((Instrux->Attributes & 0x80) == 0) {
              bVar38 = local_80 * '\x02' & 8 | bVar22 >> 3 & 7;
              (pNVar46->Info).Memory.Index = bVar38;
              if (((uint)aVar40 & 0x20) == 0) {
                if (bVar38 == 4) goto LAB_0015db4a;
              }
              else {
                if ((Instrux->FeatMode & 0x10) == 0) goto LAB_0015e05d;
                (pNVar46->Info).Memory.Index = bVar38 | 0x10;
              }
              (pNVar46->Info).Memory.IndexSize = NVar39;
            }
            else {
              (pNVar46->Info).Memory.Index =
                   (aVar40._2_1_ & 0x10) + (local_80 & 4) * '\x02' | bVar22 >> 3 & 7;
              (pNVar46->Info).Memory.IndexSize = NVar12;
            }
            uVar13 = uVar13 | 4;
            (pNVar46->Info).Register.Count =
                 (pNVar46->Info).Register.Count & 0xf0 | '\x01' << (bVar22 >> 6);
          }
        }
LAB_0015db4a:
        uVar49 = (uVar13 & 0xfff7) + ((ushort)(uVar42 >> 0xd) & 1) * 8;
        *(ushort *)&pNVar46->Info = uVar49;
        uVar9 = *(undefined8 *)&Instrux->field_0xc;
        (pNVar46->Info).Memory.DispSize = (byte)((ulong)uVar9 >> 0x10) & 0xf;
        if ((uVar42 >> 0xd & 1) == 0) {
          uVar20 = 0;
        }
        else {
          bVar38 = (byte)((uint)uVar9 >> 0xd) & 0x78;
          sVar11 = (bVar38 < 0x41) * ('@' - bVar38);
          sVar10 = (bVar38 < 0x21) * (' ' - bVar38);
          uVar20 = (ulong)((Instrux->field_74).Displacement >> ((byte)(bVar38 - 1) & 0x1f) & 1) *
                   ~((ulong)(-1L << sVar11) >> sVar11) |
                   (ulong)(((Instrux->field_74).Displacement << sVar10) >> sVar10);
        }
        (pNVar46->Info).Memory.Disp = uVar20;
        if ((uVar42 >> 10 & 1) != 0) {
          bVar38 = NdGetSegOverride(Instrux,bVar45 & 7);
          bVar45 = bVar45 & 0xf8 | bVar38;
          *(byte *)((long)&pNVar46->Info + 10) = bVar45;
        }
        NVar21 = Instrux->Attributes;
        if ((char)NVar21 < '\0') {
          if ((uVar42 >> 0xc & 1) == 0) {
            NVar18 = 0x80000030;
            goto LAB_0015ab36;
          }
          uVar49 = uVar49 | 0x4000;
          *(ushort *)&pNVar46->Info = uVar49;
          *(undefined1 *)((long)&pNVar46->Info + 7) = local_60;
          *(char *)((long)&pNVar46->Info + 9) = (char)local_64;
          (pNVar46->Info).Immediate.RawSize = (ND_UINT8)((uStack_c0 & 0xffffffff) / (ulong)local_64)
          ;
        }
        if (((uint)NVar21 >> 0x1b & 1) != 0) {
          if ((uVar42 >> 0xc & 1) == 0) {
            NVar18 = 0x80000042;
            goto LAB_0015ab36;
          }
          uVar49 = uVar49 | 0x8000;
        }
        if ((uVar42 >> 0x16 & 1) != 0) {
          if ((uVar27 & 4) == 0) {
            if ((uVar27 & 8) == 0) {
              uVar30 = 2;
              if ((uVar27 & 0x40) == 0) {
                uVar30 = (uint)(bVar29 ^ 1) * 4 + 4;
              }
            }
            else {
              uVar30 = 8;
            }
          }
          else {
            uVar30 = 4;
          }
          pNVar46->Size = uVar30;
          (pNVar46->Info).Immediate.RawSize = (ND_UINT8)uVar30;
          uVar49 = uVar49 | 0x20;
          *(char *)((long)&pNVar46->Info + 7) = (char)((uStack_c0 & 0xffffffff) / (ulong)uVar30);
        }
        if ((uVar42 >> 0x15 & 1) == 0) goto LAB_0015dd57;
        NVar12 = (ND_UINT8)pNVar46->Size;
        if ((uVar42 >> 0x16 & 1) != 0) goto switchD_0015dcb9_caseD_7;
        puVar28 = &NdGetCompDispSize_qvmszLut;
        switch(Instrux->TupleType) {
        case '\x01':
        case '\v':
          NVar12 = *(ND_UINT8 *)
                    ((long)&NdGetCompDispSize_fvmszLut + (ulong)((uint)aVar40 >> 0xe & 3));
          break;
        case '\x02':
        case '\f':
          NVar12 = *(ND_UINT8 *)
                    ((long)&NdGetCompDispSize_hvmszLut + (ulong)((uint)aVar40 >> 0xe & 3));
          break;
        case '\x03':
        case '\r':
          goto LAB_0015dd35;
        default:
          NVar12 = '\x01';
          break;
        case '\x05':
          NVar12 = '\x02';
          break;
        case '\x06':
          NVar12 = '\x04';
          if ((Instrux->Attributes & 0x400) == 0) {
            NVar12 = (local_80 & 1) * '\x04' + '\x04';
          }
          break;
        case '\a':
          break;
        case '\b':
          NVar12 = (local_80 & 1) * '\b' + '\b';
          break;
        case '\t':
          NVar12 = (local_80 & 1) * '\x10' + '\x10';
          break;
        case '\n':
          NVar12 = ' ';
          break;
        case '\x0e':
          puVar28 = (undefined4 *)&NdGetCompDispSize_ovmszLut;
          goto LAB_0015dd35;
        case '\x0f':
        case '\x11':
          NVar12 = '\x10';
          break;
        case '\x10':
          puVar28 = &NdGetCompDispSize_dupszLut;
LAB_0015dd35:
          NVar12 = *(ND_UINT8 *)((ulong)((uint)aVar40 >> 0xe & 3) + (long)puVar28);
        }
switchD_0015dcb9_caseD_7:
        uVar49 = uVar49 | 0x10;
        (pNVar46->Info).Memory.CompDispSize = NVar12;
LAB_0015dd57:
        uVar30 = (uint)Instrux->Attributes;
        uVar37 = (ushort)((uVar30 & 0x100) << 5);
        uVar13 = (ushort)(Instrux->Attributes >> 9) & 0x800;
        uVar24 = uVar13 | uVar49 & 0xd7ff | uVar37;
        *(ushort *)&pNVar46->Info = uVar24;
        if ((uVar30 >> 0x15 & 1) != 0) {
          uVar24 = uVar13 | uVar49 & 0xc7fe | uVar37 | 0x1000;
          *(ushort *)&pNVar46->Info = uVar24;
          *(byte *)((long)&pNVar46->Info + 10) = bVar45 & 0xf8;
        }
        if ((uVar30 >> 0x16 & 1) != 0) {
          *(ushort *)&pNVar46->Info = uVar24 | 0x200;
          (pNVar46->Info).Memory.ShStkType = '\x01';
        }
        break;
      case 0x1f:
        uVar23 = 0x317;
        *(byte *)pNVar46 = 0xa1;
        (pNVar46->Info).Immediate.Imm = 0x80000000a;
LAB_0015d24a:
        NVar19 = (uint)aVar40 >> (sbyte)uVar23 & (1 << (sbyte)((ushort)uVar23 >> 8)) - ND_REG_GPR;
LAB_0015d62f:
        (pNVar46->Info).Register.Reg = NVar19;
        break;
      case 0x20:
        *(byte *)pNVar46 = 0x12;
        uVar49 = (ushort)(pNVar46->Info).Register.Type;
        *(ushort *)&pNVar46->Info = uVar49 | 2;
        bVar29 = (local_80 & 2) << 5 | (Instrux->ModRm).ModRm & 0x38;
        *(byte *)((long)&pNVar46->Info + 10) = *(byte *)((long)&pNVar46->Info + 10) & 7 | bVar29;
        if (((uint)aVar40 & 0x10) != 0) {
          if ((Instrux->FeatMode & 0x10) == 0) goto LAB_0015e05d;
          bVar29 = bVar29 | 0x80;
        }
        (pNVar46->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
        *(ushort *)&pNVar46->Info = uVar49 | 3;
LAB_0015c9c5:
        *(byte *)((long)&pNVar46->Info + 10) = bVar29;
        break;
      case 0x21:
        *(byte *)pNVar46 = 0x22;
        uVar49 = (ushort)(pNVar46->Info).Register.Type;
        *(ushort *)&pNVar46->Info = uVar49 | 2;
        bVar38 = (local_80 & 8 | (Instrux->ModRm).ModRm & 7) << 3;
        bVar29 = *(byte *)((long)&pNVar46->Info + 10) & 7 | bVar38;
        *(byte *)((long)&pNVar46->Info + 10) = bVar29;
        if (((uint)aVar40 & 0x40) != 0) {
          if ((Instrux->FeatMode & 0x10) == 0) goto LAB_0015e05d;
          bVar38 = bVar38 | 0x80;
          *(byte *)((long)&pNVar46->Info + 10) = bVar29 | 0x80;
        }
        (pNVar46->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
        *(ushort *)&pNVar46->Info = uVar49 | 3;
LAB_0015c887:
        bVar29 = NdGetSegOverride(Instrux,'\x03');
        bVar29 = bVar29 | bVar38;
        goto LAB_0015d780;
      case 0x22:
        *(byte *)pNVar46 = 0x11;
        (pNVar46->Info).Register.Type = ND_REG_TILE;
        (pNVar46->Info).Register.Size = uVar42;
        bVar29 = (Instrux->ModRm).ModRm >> 3;
        local_80 = local_80 & 0x12;
        goto LAB_0015c70a;
      case 0x23:
        *(byte *)pNVar46 = 0x21;
        (pNVar46->Info).Register.Type = ND_REG_TILE;
        (pNVar46->Info).Register.Size = uVar42;
        bVar29 = (Instrux->ModRm).ModRm;
        local_80 = local_80 & 0x48;
LAB_0015c70a:
        (pNVar46->Info).Register.Reg = bVar29 & 7;
        if (local_80 == 0) break;
        goto LAB_0015e05d;
      case 0x24:
        *(byte *)pNVar46 = 0x31;
        (pNVar46->Info).Register.Type = ND_REG_TILE;
        (pNVar46->Info).Register.Size = uVar42;
        uVar30 = (uint)aVar40 >> 0x10 & 0xf;
        NVar18 = 0x80000005;
        (pNVar46->Info).Register.Reg = uVar30;
        if ((((uint)aVar40 >> 0x14 & 1) != 0) || (7 < uVar30)) goto LAB_0015ab36;
        break;
      case 0x25:
        *(byte *)pNVar46 = 0x39;
        (pNVar46->Info).DefaultFlags =
             (ND_OPDESC_DEFAULT_FLAGS)
             (aVar40._2_1_ & 0xf | (byte)(pNVar46->Info).DefaultFlags & 0xf0);
        pNVar46->Size = 0;
        break;
      case 0x26:
        *(byte *)pNVar46 = 0x87;
        (pNVar46->Info).Immediate.Imm = 1;
        break;
      case 0x27:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_RIP;
        (pNVar46->Info).Register.Size = uVar42;
        (pNVar46->Info).Register.Reg = 0;
        Instrux->RipAccess = Instrux->RipAccess | bVar45;
        if (((Instrux->Operands[0].Flags.Flags & 1) != 0) ||
           (bVar29 = 4, 1 < (byte)((*(byte *)pNVar1 & 0xf) - 1))) {
          bVar29 = (Instrux->Category == ND_CAT_RET) << 2;
        }
        Instrux->BranchInfo =
             (ND_BRANCH_INFO)
             (((Instrux->CsAccess & 10) != 0) << 3 | bVar29 |
              (byte)Instrux->BranchInfo & 0xf0 | (Instrux->Category == ND_CAT_COND_BR) * '\x02' | 1)
        ;
        break;
      case 0x28:
        NVar21 = 0x400000010;
        *(byte *)pNVar46 = 0xc1;
        goto LAB_0015d3e0;
      case 0x29:
        *(byte *)pNVar46 = 0xc1;
        NVar21 = 0x400000011;
        goto LAB_0015d3e0;
      case 0x2a:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_SSP;
        goto LAB_0015d6d0;
      case 0x2b:
        *(byte *)pNVar46 = 0xc1;
        NVar21 = 0x100000015;
LAB_0015d3e0:
        (pNVar46->Info).Immediate.Imm = NVar21;
        goto LAB_0015d6d8;
      case 0x2c:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x100000001;
        (pNVar46->Info).Register.Reg = 4;
        pbVar2 = (byte *)((long)&pNVar46->Info + 0xd);
        *pbVar2 = *pbVar2 | 1;
        break;
      case 0x2d:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        goto LAB_0015d6d0;
      case 0x2e:
        *(byte *)pNVar46 = 0xc1;
        NVar19 = ND_REG_GPR;
        goto LAB_0015cac2;
      case 0x2f:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        goto LAB_0015d5f5;
      case 0x30:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        goto LAB_0015d72f;
      case 0x31:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        goto LAB_0015d1a6;
      case 0x32:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        goto LAB_0015d1c8;
      case 0x33:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        (pNVar46->Info).Register.Size = uVar42;
        (pNVar46->Info).Register.Reg = 6;
        break;
      case 0x34:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        (pNVar46->Info).Register.Size = uVar42;
        (pNVar46->Info).Register.Reg = 7;
        break;
      case 0x35:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        (pNVar46->Info).Register.Size = uVar42;
        (pNVar46->Info).Register.Reg = 8;
        break;
      case 0x36:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        (pNVar46->Info).Register.Size = uVar42;
        (pNVar46->Info).Register.Reg = 9;
        break;
      case 0x37:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_GPR;
        (pNVar46->Info).Register.Size = uVar42;
        (pNVar46->Info).Register.Reg = 0xb;
        break;
      case 0x38:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_SEG;
        (pNVar46->Info).Register.Size = uVar42;
        (pNVar46->Info).Register.Reg = 1;
        Instrux->CsAccess = Instrux->CsAccess | bVar45;
        break;
      case 0x39:
        *(byte *)pNVar46 = 0xc1;
        NVar19 = ND_REG_SEG;
LAB_0015cac2:
        (pNVar46->Info).Register.Type = NVar19;
        (pNVar46->Info).Register.Size = uVar42;
        goto LAB_0015d62f;
      case 0x3a:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_SEG;
        goto LAB_0015d72f;
      case 0x3b:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_SEG;
        goto LAB_0015d6d0;
      case 0x3c:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_SEG;
LAB_0015d1a6:
        (pNVar46->Info).Register.Size = uVar42;
        (pNVar46->Info).Register.Reg = 4;
        break;
      case 0x3d:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_SEG;
LAB_0015d1c8:
        (pNVar46->Info).Register.Size = uVar42;
        (pNVar46->Info).Register.Reg = 5;
        break;
      case 0x3e:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0xa00000003;
        goto LAB_0015d6d8;
      case 0x3f:
        *(byte *)pNVar46 = 0x21;
        (pNVar46->Info).Immediate.Imm = 0xa00000003;
        NVar19 = (ND_REG_TYPE)(Instrux->ModRm).ModRm;
LAB_0015cfb6:
        NVar19 = NVar19 & ND_REG_DR;
        goto LAB_0015d62f;
      default:
        uVar16 = uVar16 - 0x40;
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x1000000005;
LAB_0015c45f:
        (pNVar46->Info).Register.Reg = uVar16;
        break;
      case 0x48:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0xc2;
        (pNVar46->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
        pbVar2 = (byte *)((long)&pNVar46->Info + 10);
        *pbVar2 = *pbVar2 & 7;
        *(ushort *)&pNVar46->Info = *(ushort *)&pNVar46->Info | 3;
        bVar29 = NdGetSegOverride(Instrux,'\x03');
        goto LAB_0015d780;
      case 0x49:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0xc2;
        (pNVar46->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
        *(byte *)((long)&pNVar46->Info + 10) = *(byte *)((long)&pNVar46->Info + 10) & 7 | 8;
        *(ushort *)&pNVar46->Info = *(ushort *)&pNVar46->Info | 3;
        bVar29 = NdGetSegOverride(Instrux,'\x03');
        bVar29 = bVar29 | 8;
        goto LAB_0015d780;
      case 0x4a:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0xc2;
        (pNVar46->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
        (pNVar46->Info).Memory.IndexSize = '\x01';
        *(byte *)((long)&pNVar46->Info + 10) = *(byte *)((long)&pNVar46->Info + 10) & 7 | 0x18;
        (pNVar46->Info).Memory.Index = '\0';
        (pNVar46->Info).Register.Count = ((pNVar46->Info).Register.Count & 0xf0) + 1;
        *(ushort *)&pNVar46->Info = *(ushort *)&pNVar46->Info | 7;
        bVar29 = NdGetSegOverride(Instrux,'\x03');
        bVar29 = bVar29 | 0x18;
LAB_0015d780:
        *(byte *)((long)&pNVar46->Info + 10) = bVar29;
        break;
      case 0x4c:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0xc2;
        (pNVar46->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 4 & 3));
        *(ushort *)&pNVar46->Info = *(ushort *)&pNVar46->Info | 3;
        *(undefined1 *)((long)&pNVar46->Info + 10) = 0x2a;
        break;
      case 0x4d:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0xc2;
        pbVar2 = (byte *)((long)&pNVar46->Info + 1);
        *pbVar2 = *pbVar2 | 2;
        (pNVar46->Info).Memory.ShStkType = '\x02';
        break;
      case 0x4e:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0xc2;
        pbVar2 = (byte *)((long)&pNVar46->Info + 1);
        *pbVar2 = *pbVar2 | 2;
        (pNVar46->Info).Memory.ShStkType = '\x03';
        break;
      case 0x4f:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0xc2;
        pbVar2 = (byte *)((long)&pNVar46->Info + 1);
        *pbVar2 = *pbVar2 | 2;
        (pNVar46->Info).Memory.ShStkType = '\x04';
        break;
      case 0x50:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0xc2;
        uVar49 = (ushort)(pNVar46->Info).Register.Type;
        (pNVar46->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
        bVar29 = *(byte *)((long)&pNVar46->Info + 10) & 7 | 0x30;
        goto LAB_0015d185;
      case 0x51:
        Instrux->MemoryAccess = Instrux->MemoryAccess | bVar45;
        *(byte *)pNVar46 = 0xc2;
        uVar49 = (ushort)(pNVar46->Info).Register.Type;
        (pNVar46->Info).Memory.BaseSize = (ND_UINT8)(2 << (*(byte *)Instrux >> 6));
        bVar29 = *(byte *)((long)&pNVar46->Info + 10) & 7 | 0x38;
LAB_0015d185:
        *(byte *)((long)&pNVar46->Info + 10) = bVar29;
        *(ushort *)&pNVar46->Info = uVar49 & 0xfffc | 2;
        break;
      case 0x52:
        *(byte *)pNVar46 = 0x93;
        *(ulong *)&pNVar46->Info = (ulong)((Instrux->field_76).Immediate2 & 3);
        (pNVar46->Info).Immediate.RawSize = bVar22;
        break;
      case 0x53:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_CR;
        goto LAB_0015d6d0;
      case 0x54:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_SYS;
        (pNVar46->Info).Register.Size = uVar42;
        goto LAB_0015d81b;
      case 0x55:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_SYS;
LAB_0015d6d0:
        (pNVar46->Info).Register.Size = uVar42;
LAB_0015d6d8:
        (pNVar46->Info).Register.Reg = 0;
        break;
      case 0x56:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_SYS;
LAB_0015d5f5:
        (pNVar46->Info).Register.Size = uVar42;
LAB_0015d805:
        (pNVar46->Info).Register.Reg = 2;
        break;
      case 0x57:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Register.Type = ND_REG_SYS;
LAB_0015d72f:
        (pNVar46->Info).Register.Size = uVar42;
        (pNVar46->Info).Register.Reg = 3;
        break;
      case 0x58:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x20000000e;
        goto LAB_0015d6d8;
      case 0x59:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x20000000e;
LAB_0015d81b:
        (pNVar46->Info).Register.Reg = 1;
        break;
      case 0x5a:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x20000000e;
        goto LAB_0015d805;
      case 0x5b:
        *(byte *)pNVar46 = 0xb1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0xffffffff;
        break;
      case 0x5c:
        *(byte *)pNVar46 = 0xb1;
        (pNVar46->Info).Immediate.Imm = 0x80000000d;
        (pNVar46->Info).Register.Reg = 0xff;
        break;
      case 0x5d:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0x10;
        break;
      case 0x5e:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0xc0000103;
        break;
      case 0x5f:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0x176;
        break;
      case 0x60:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0x175;
        break;
      case 0x61:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0x174;
        break;
      case 0x62:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0xc0000081;
        break;
      case 99:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0xc0000082;
        break;
      case 100:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0xc0000084;
        break;
      case 0x65:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0xc0000100;
        break;
      case 0x66:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0xc0000101;
        break;
      case 0x67:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000c;
        (pNVar46->Info).Register.Reg = 0xc0000102;
        break;
      case 0x68:
        *(byte *)pNVar46 = 0xc1;
        (pNVar46->Info).Immediate.Imm = 0x80000000d;
        goto LAB_0015d6d8;
      case 0x69:
        if ((Instrux->Instruction == ND_INS_PUSHA) || (Instrux->Instruction == ND_INS_POPA)) {
          *(byte *)pNVar46 = 0xc1;
          uVar30 = *(uint *)&Instrux->field_0xc & 0xf;
          pNVar46->Size = uVar30;
          (pNVar46->Info).Register.Type = ND_REG_GPR;
          (pNVar46->Info).Register.Size = uVar30;
          (pNVar46->Info).Register.Reg = 0;
          (pNVar46->Info).Register.Count = '\b';
          pbVar2 = (byte *)((long)&pNVar46->Info + 0xd);
          *pbVar2 = *pbVar2 | 2;
        }
        else {
          *(byte *)pNVar46 = 200;
        }
      }
      bVar29 = *(byte *)pNVar46;
      if ((bVar29 & 0xf) == 1) {
        NVar12 = (ND_UINT8)(uVar26 >> 0x28);
        uVar30 = (uint)(uVar26 >> 0x28) & 0xff;
        if (uVar30 == 0) {
          NVar12 = '\x01';
        }
        else {
          pNVar3 = &(pNVar46->Info).Register.Reg;
          *pNVar3 = *pNVar3 & -uVar30;
          pbVar2 = (byte *)((long)&pNVar46->Info + 0xd);
          *pbVar2 = *pbVar2 | 2;
        }
        (pNVar46->Info).Register.Count = NVar12;
        if ((((Instrux->field_0x8 & 0x28) != 0) && (((pNVar46->Access).Access & 2) != 0)) &&
           (((pNVar46->Flags).Flags & 1) == 0)) {
          pbVar2 = (byte *)((long)&pNVar46->Info + 0xd);
          *pbVar2 = *pbVar2 | 4;
        }
      }
      if ((char)(uVar26 >> 0x20) != '\0') {
        if (((uVar27 & 1) != 0) && ((Instrux->field_0x7 & 0x80) != 0)) {
          pNVar46->Decorator =
               (ND_OPERAND_DECORATOR)
               (((byte)pNVar46->Decorator & 0xc6 | (byte)((uint)Instrux->Exs >> 0x14) & 0x38) + 1);
        }
        if (((uVar27 & 2) != 0) && ((Instrux->field_0x8 & 1) != 0)) {
          if ((bVar29 & 0xf) == 2) {
            NVar18 = 0x80000037;
            goto LAB_0015ab36;
          }
          pNVar46->Decorator = (ND_OPERAND_DECORATOR)((byte)pNVar46->Decorator | 2);
        }
        if (((uVar27 & 0x4c) != 0) && ((Instrux->field_0x7 & 0x40) != 0)) {
          pNVar46->Decorator = (ND_OPERAND_DECORATOR)((byte)pNVar46->Decorator | 4);
        }
      }
      bVar38 = Instrux->field_0x39;
    }
    if (((undefined1  [488])*Instrux & (undefined1  [488])0xf0000) != (undefined1  [488])0x0) {
      uVar47 = Instrux->Attributes;
      if ((((uVar47 >> 0x22 & 1) == 0) ||
          (NVar17 = 0x80000032, ((Instrux->Exs).field_0x2 & 0xf) == 0)) &&
         (((uVar47 >> 0x23 & 1) == 0 ||
          (NVar17 = 0x80000040, ((Instrux->Exs).field_0x2 & 0x10) == 0)))) {
        if (((char)uVar47 < '\0') && (Instrux->Category != ND_CAT_SCATTER)) {
          local_58[0] = 0;
          local_58[1] = 0;
          local_58[2] = 0;
          local_58[3] = 0;
          local_58[4] = 0;
          local_58[5] = 0;
          local_58[6] = 0;
          local_58[7] = 0;
          local_58[8] = 0;
          local_58[9] = 0;
          local_58[10] = 0;
          local_58[0xb] = 0;
          local_58[0xc] = 0;
          local_58[0xd] = 0;
          local_58[0xe] = 0;
          local_58[0xf] = 0;
          local_58[0x10] = 0;
          local_58[0x11] = 0;
          local_58[0x12] = 0;
          local_58[0x13] = 0;
          local_58[0x14] = 0;
          local_58[0x15] = 0;
          local_58[0x16] = 0;
          local_58[0x17] = 0;
          local_58[0x18] = 0;
          local_58[0x19] = 0;
          local_58[0x1a] = 0;
          local_58[0x1b] = 0;
          local_58[0x1c] = 0;
          local_58[0x1d] = 0;
          local_58[0x1e] = 0;
          local_58[0x1f] = 0;
          for (lVar41 = 0; (ulong)(bVar38 & 0xf) * 0x20 != lVar41; lVar41 = lVar41 + 0x20) {
            bVar29 = (&Instrux->Operands[0].field_0x0)[lVar41] & 0xf;
            if (bVar29 == 2) {
              uVar47 = (ulong)*(byte *)((long)&Instrux->Operands[0].Info + lVar41 + 0xb);
LAB_0015e1ae:
              bVar29 = local_58[uVar47];
              local_58[uVar47] = bVar29 + 1;
              if (1 < (byte)(bVar29 + 1)) {
                NVar17 = 0x80000031;
                goto LAB_0015e41f;
              }
            }
            else if ((bVar29 == 1) && (*(int *)((long)&Instrux->Operands[0].Info + lVar41) == 5)) {
              uVar47 = (ulong)*(uint *)((long)&Instrux->Operands[0].Info + lVar41 + 8);
              goto LAB_0015e1ae;
            }
          }
        }
        NVar12 = Instrux->ExceptionType;
        NVar18 = 0;
        if ((NVar12 == '\x17') || (NVar12 == '#')) {
          if (((undefined1  [32])((undefined1  [32])*pNVar1 & (undefined1  [32])0xf) !=
               (undefined1  [32])0x1) ||
             ((((undefined1  [32])((undefined1  [32])Instrux->Operands[2] & (undefined1  [32])0xf)
                != (undefined1  [32])0x1 ||
               (NVar17 = 0x80000044,
               Instrux->Operands[0].Info.Register.Reg != Instrux->Operands[2].Info.Register.Reg)) &&
              (((undefined1  [32])((undefined1  [32])Instrux->Operands[3] & (undefined1  [32])0xf)
                != (undefined1  [32])0x1 ||
               (NVar17 = 0x80000044,
               Instrux->Operands[0].Info.Register.Reg != Instrux->Operands[3].Info.Register.Reg)))))
             ) goto LAB_0015ab36;
        }
        else {
          if (NVar12 != '+') {
            if (NVar12 == 'H') {
              NVar6 = Instrux->Operands[0].Info.Register.Reg;
              NVar17 = 0x80000044;
              if (((NVar6 != 4) && (NVar7 = Instrux->Operands[1].Info.Register.Reg, NVar7 != 4)) &&
                 ((NVar6 != NVar7 || ((Instrux->Operands[0].Access.Access & 2) == 0))))
              goto LAB_0015ab36;
              goto LAB_0015e41f;
            }
            if (NVar12 != '1') goto LAB_0015ab36;
          }
          NVar6 = Instrux->Operands[0].Info.Register.Reg;
          NVar7 = Instrux->Operands[1].Info.Register.Reg;
          NVar17 = 0x80000043;
          if ((NVar6 != NVar7) &&
             (NVar8 = Instrux->Operands[2].Info.Register.Reg, NVar7 != NVar8 && NVar6 != NVar8))
          goto LAB_0015ab36;
        }
      }
LAB_0015e41f:
      NVar18 = NVar17;
      goto LAB_0015ab36;
    }
    uVar30 = *(uint *)&Instrux->field_0x5;
    if (((char)uVar30 < '\0') &&
       ((((undefined1  [488])*Instrux & (undefined1  [488])0x3) != (undefined1  [488])0x1 ||
        ((Instrux->Attributes & 0x1000) == 0)))) {
      NVar18 = 0x8000000a;
      if ((((ushort)Instrux->ValidPrefixes & 4) == 0) ||
         ((undefined1  [32])((undefined1  [32])*pNVar1 & (undefined1  [32])0xf) !=
          (undefined1  [32])0x2)) goto LAB_0015ab36;
      Instrux->field_0x9 = Instrux->field_0x9 | 4;
    }
    NVar12 = Instrux->Rep;
    if (NVar12 != '\0') {
      if ((Instrux->Attributes & 0x100000000) != 0) goto LAB_0015e2b7;
      uVar49 = (Instrux->ValidPrefixes).Raw;
      uVar13 = *(ushort *)&Instrux->field_0x9;
      uVar37 = 0x400;
      if ((uVar49 & 1) == 0) {
        uVar37 = (uVar49 & 2) << 9;
      }
      uVar37 = ((ushort)(NVar12 == 0xf2) << 8 & uVar49 * 4 | uVar13 & 0xfae7 | uVar37) +
               (uVar49 & 3) * 8;
      *(ushort *)&Instrux->field_0x9 = uVar37;
      if ((((uVar49 & 0x100) != 0 || (uVar13 & 4) != 0) &&
          ((undefined1  [32])((undefined1  [32])*pNVar1 & (undefined1  [32])0xf) ==
           (undefined1  [32])0x2)) &&
         ((uVar13 = 0x20, NVar12 == 0xf2 && (uVar49 & 0x18) != 0 ||
          (uVar13 = 0x40, NVar12 == 0xf3 && (uVar49 & 0x28) != 0)))) {
        *(ushort *)&Instrux->field_0x9 = uVar13 | uVar37;
      }
    }
    bVar29 = Instrux->Seg;
    if (bVar29 != 0) {
      if ((char)(Instrux->ValidPrefixes).Raw < '\0') {
        uVar49 = 0x80;
        if ((bVar29 | 0x10) != 0x3e) {
          uVar49 = (ushort)(bVar29 == 100) << 7;
        }
      }
      else {
        uVar49 = 0;
      }
      *(ushort *)&Instrux->field_0x9 =
           uVar49 | (ushort)(bVar29 == 0x3e) << 9 & (Instrux->ValidPrefixes).Raw |
           *(ushort *)&Instrux->field_0x9 & 0xfd7f;
    }
    uVar42 = (uint)Instrux->Attributes;
    if (((uVar42 >> 0x1a & 1) == 0 || (uVar30 & 0x20) == 0) &&
       ((Instrux->Attributes >> 0x21 & 1) == 0 || (uVar30 & 0x40) == 0)) {
      NVar18 = 0x80000002;
      if (-1 < (int)uVar42 || (uVar30 & 2) == 0) {
        NVar18 = 0;
        uVar49 = (~*(ushort *)&Instrux->field_0x9 & 0x200) << 2;
        if ((uVar42 >> 0x17 & 1) == 0) {
          uVar49 = 0;
        }
        *(ushort *)&Instrux->field_0x9 = *(ushort *)&Instrux->field_0x9 & 0xf7ff | uVar49;
      }
      goto LAB_0015ab36;
    }
  }
LAB_0015e2b7:
  NVar18 = 0x80000002;
LAB_0015ab36:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return NVar18;
  }
  __stack_chk_fail();
}

Assistant:

NDSTATUS
NdDecodeWithContext(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_SIZET Size,
    ND_CONTEXT *Context
    )
{
    NDSTATUS status;
    PND_IDBE pIns;
    ND_UINT32 opIndex;

    // pre-init
    status = ND_STATUS_SUCCESS;
    pIns = (PND_IDBE)ND_NULL;
    opIndex = 0;

    // validate
    if (ND_NULL == Instrux)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_NULL == Code)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (Size == 0)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_NULL == Context)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_CODE_64 < Context->DefCode)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_DATA_64 < Context->DefData)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_VEND_MAX < Context->VendMode)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (0 == (Context->Options & ND_OPTION_SKIP_ZERO_INSTRUX))
    {
        // Initialize with zero.
        nd_memzero(Instrux, sizeof(INSTRUX));
    }

    Instrux->DefCode = (ND_UINT8)Context->DefCode;
    Instrux->DefData = (ND_UINT8)Context->DefData;
    Instrux->DefStack = (ND_UINT8)Context->DefStack;
    Instrux->VendMode = (ND_UINT8)Context->VendMode;
    Instrux->FeatMode = (ND_UINT8)Context->FeatMode;
    Instrux->EncMode = ND_ENCM_LEGACY;  // Assume legacy encoding by default.

    // Fetch the instruction bytes.
    for (opIndex = 0; 
         opIndex < ((Size < ND_MAX_INSTRUCTION_LENGTH) ? Size : ND_MAX_INSTRUCTION_LENGTH); 
         opIndex++)
    {
        Instrux->InstructionBytes[opIndex] = Code[opIndex];
    }

    if (gPrefixesMap[Instrux->InstructionBytes[0]] != ND_PREF_CODE_NONE)
    {
        // Fetch prefixes. We peek at the first byte, to see if it's worth calling the prefix decoder.
        status = NdFetchPrefixes(Instrux, Instrux->InstructionBytes, 0, Size);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    // Get addressing mode & operand size.
    status = NdGetAddrAndOpMode(Instrux);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Start iterating the tables, in order to extract the instruction entry.
    status = NdFindInstruction(Instrux, Instrux->InstructionBytes, Size, &pIns);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Copy information inside the Instrux.
    status = NdCopyInstructionInfo(Instrux, pIns);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Get effective operand mode.
    status = NdGetEffectiveAddrAndOpMode(Instrux);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    if (Instrux->HasEvex)
    {
        // Post-process EVEX encoded instructions. This does two thing:
        // - check and fill in decorator info;
        // - generate error for invalid broadcast/rounding, mask or zeroing bits;
        // - generate error if any reserved bits are set.
        status = NdGetEvexFields(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    if (ND_HAS_VECTOR(Instrux))
    {
        // Get vector length.
        status = NdGetVectorLength(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    Instrux->ExpOperandsCount = ND_EXP_OPS_CNT(pIns->OpsCount);
    Instrux->OperandsCount = Instrux->ExpOperandsCount;

    if (!(Context->Options & ND_OPTION_ONLY_EXPLICIT_OPERANDS))
    {
        Instrux->OperandsCount += ND_IMP_OPS_CNT(pIns->OpsCount);
    }

    // And now decode each operand.
    for (opIndex = 0; opIndex < Instrux->OperandsCount; ++opIndex)
    {
        status = NdParseOperand(Instrux, Instrux->InstructionBytes, Instrux->Length, Size, 
                                opIndex, pIns->Operands[opIndex]);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    if (ND_ENCM_LEGACY == Instrux->EncMode)
    {
        // Do legacy prefix checks. Only available for legacy instructions. For XOP/VEX/EVEX instructions:
        // 1. LOCK, REP, 0x66, REX, REX2 cause #UD (checkd during XOP/VEX/EVEX fetch)
        // 2. Segment prefixes do not have BHINT or DNT semantic
        // 3. 0x67 can be used to override address mode
        // This has to be done after operand parsing, since some #UD conditions depend on them.
        status = NdLegacyPrefixChecks(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }
    else
    {
        // Do XOP/VEX/EVEX encoding checks. Additional #UD conditions, some dependent on encoded registers.
        // This has to be done after operand parsing, since some #UD conditions depend on them.
        status = NdVexExceptionChecks(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    // All done! Instruction successfully decoded!
    return ND_STATUS_SUCCESS;
}